

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long lVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar80;
  undefined8 uVar81;
  ulong uVar82;
  RTCIntersectArguments *pRVar83;
  ulong uVar84;
  RTCIntersectArguments *pRVar85;
  Primitive *pPVar86;
  uint uVar87;
  ulong uVar88;
  Geometry *geometry;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  long lVar89;
  bool bVar90;
  float fVar91;
  float fVar136;
  float fVar138;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar96 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar97 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar142;
  float fVar143;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined4 uVar144;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  float fVar156;
  float fVar157;
  float fVar161;
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar173;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  undefined1 in_ZMM4 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_684;
  ulong local_680;
  Ray *local_678;
  RayQueryContext *local_670;
  undefined4 local_664;
  undefined1 local_660 [16];
  Primitive *local_650;
  Precalculations *local_648;
  undefined1 local_640 [24];
  ulong local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5e0;
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [32];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  undefined4 uStack_4fc;
  undefined8 uStack_4f8;
  ulong local_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [12];
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int iStack_4a8;
  int iStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  uint local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar80 = (ulong)(byte)PVar9;
  lVar72 = uVar80 * 0x19;
  fVar157 = *(float *)(prim + lVar72 + 0x12);
  auVar96 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar72 + 6));
  fVar149 = fVar157 * (ray->dir).field_0.m128[0];
  fVar156 = fVar157 * auVar96._0_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar106 = vpmovsxbd_avx2(auVar94);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar105 = vpmovsxbd_avx2(auVar92);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar115 = vpmovsxbd_avx2(auVar98);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar116 = vpmovsxbd_avx2(auVar197);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar114 = vpmovsxbd_avx2(auVar6);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar80 + 6);
  auVar113 = vpmovsxbd_avx2(auVar7);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar88 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar107 = vpmovsxbd_avx2(auVar8);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar88 + uVar80 + 6);
  auVar103 = vpmovsxbd_avx2(auVar93);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar108 = vcvtdq2ps_avx(auVar103);
  uVar84 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar112 = vpmovsxbd_avx2(auVar95);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar189._4_4_ = fVar149;
  auVar189._0_4_ = fVar149;
  auVar189._8_4_ = fVar149;
  auVar189._12_4_ = fVar149;
  auVar189._16_4_ = fVar149;
  auVar189._20_4_ = fVar149;
  auVar189._24_4_ = fVar149;
  auVar189._28_4_ = fVar149;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar104 = ZEXT1632(CONCAT412(fVar157 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar157 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar157 * (ray->dir).field_0.m128[1],fVar149))));
  auVar100 = vpermps_avx512vl(auVar99,auVar104);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = vpermps_avx512vl(auVar101,auVar104);
  fVar149 = auVar102._0_4_;
  auVar155._0_4_ = fVar149 * auVar115._0_4_;
  fVar162 = auVar102._4_4_;
  auVar155._4_4_ = fVar162 * auVar115._4_4_;
  fVar171 = auVar102._8_4_;
  auVar155._8_4_ = fVar171 * auVar115._8_4_;
  fVar172 = auVar102._12_4_;
  auVar155._12_4_ = fVar172 * auVar115._12_4_;
  fVar173 = auVar102._16_4_;
  auVar155._16_4_ = fVar173 * auVar115._16_4_;
  fVar161 = auVar102._20_4_;
  auVar155._20_4_ = fVar161 * auVar115._20_4_;
  fVar91 = auVar102._24_4_;
  auVar155._28_36_ = in_ZMM4._28_36_;
  auVar155._24_4_ = fVar91 * auVar115._24_4_;
  auVar104._4_4_ = auVar113._4_4_ * fVar162;
  auVar104._0_4_ = auVar113._0_4_ * fVar149;
  auVar104._8_4_ = auVar113._8_4_ * fVar171;
  auVar104._12_4_ = auVar113._12_4_ * fVar172;
  auVar104._16_4_ = auVar113._16_4_ * fVar173;
  auVar104._20_4_ = auVar113._20_4_ * fVar161;
  auVar104._24_4_ = auVar113._24_4_ * fVar91;
  auVar104._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar112._4_4_ * fVar162;
  auVar103._0_4_ = auVar112._0_4_ * fVar149;
  auVar103._8_4_ = auVar112._8_4_ * fVar171;
  auVar103._12_4_ = auVar112._12_4_ * fVar172;
  auVar103._16_4_ = auVar112._16_4_ * fVar173;
  auVar103._20_4_ = auVar112._20_4_ * fVar161;
  auVar103._24_4_ = auVar112._24_4_ * fVar91;
  auVar103._28_4_ = auVar102._28_4_;
  auVar94 = vfmadd231ps_fma(auVar155._0_32_,auVar100,auVar105);
  auVar92 = vfmadd231ps_fma(auVar104,auVar100,auVar114);
  auVar98 = vfmadd231ps_fma(auVar103,auVar108,auVar100);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar189,auVar106);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar189,auVar116);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar107,auVar189);
  auVar190._4_4_ = fVar156;
  auVar190._0_4_ = fVar156;
  auVar190._8_4_ = fVar156;
  auVar190._12_4_ = fVar156;
  auVar190._16_4_ = fVar156;
  auVar190._20_4_ = fVar156;
  auVar190._24_4_ = fVar156;
  auVar190._28_4_ = fVar156;
  auVar104 = ZEXT1632(CONCAT412(fVar157 * auVar96._12_4_,
                                CONCAT48(fVar157 * auVar96._8_4_,
                                         CONCAT44(fVar157 * auVar96._4_4_,fVar156))));
  auVar103 = vpermps_avx512vl(auVar99,auVar104);
  auVar104 = vpermps_avx512vl(auVar101,auVar104);
  fVar157 = auVar104._0_4_;
  fVar149 = auVar104._4_4_;
  auVar99._4_4_ = fVar149 * auVar115._4_4_;
  auVar99._0_4_ = fVar157 * auVar115._0_4_;
  fVar162 = auVar104._8_4_;
  auVar99._8_4_ = fVar162 * auVar115._8_4_;
  fVar171 = auVar104._12_4_;
  auVar99._12_4_ = fVar171 * auVar115._12_4_;
  fVar172 = auVar104._16_4_;
  auVar99._16_4_ = fVar172 * auVar115._16_4_;
  fVar173 = auVar104._20_4_;
  auVar99._20_4_ = fVar173 * auVar115._20_4_;
  fVar161 = auVar104._24_4_;
  auVar99._24_4_ = fVar161 * auVar115._24_4_;
  auVar99._28_4_ = auVar115._28_4_;
  auVar110._0_4_ = auVar113._0_4_ * fVar157;
  auVar110._4_4_ = auVar113._4_4_ * fVar149;
  auVar110._8_4_ = auVar113._8_4_ * fVar162;
  auVar110._12_4_ = auVar113._12_4_ * fVar171;
  auVar110._16_4_ = auVar113._16_4_ * fVar172;
  auVar110._20_4_ = auVar113._20_4_ * fVar173;
  auVar110._24_4_ = auVar113._24_4_ * fVar161;
  auVar110._28_4_ = 0;
  auVar113._4_4_ = auVar112._4_4_ * fVar149;
  auVar113._0_4_ = auVar112._0_4_ * fVar157;
  auVar113._8_4_ = auVar112._8_4_ * fVar162;
  auVar113._12_4_ = auVar112._12_4_ * fVar171;
  auVar113._16_4_ = auVar112._16_4_ * fVar172;
  auVar113._20_4_ = auVar112._20_4_ * fVar173;
  auVar113._24_4_ = auVar112._24_4_ * fVar161;
  auVar113._28_4_ = auVar104._28_4_;
  auVar197 = vfmadd231ps_fma(auVar99,auVar103,auVar105);
  auVar6 = vfmadd231ps_fma(auVar110,auVar103,auVar114);
  auVar7 = vfmadd231ps_fma(auVar113,auVar103,auVar108);
  auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar190,auVar106);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar190,auVar116);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar190,auVar107);
  auVar182._8_4_ = 0x7fffffff;
  auVar182._0_8_ = 0x7fffffff7fffffff;
  auVar182._12_4_ = 0x7fffffff;
  auVar182._16_4_ = 0x7fffffff;
  auVar182._20_4_ = 0x7fffffff;
  auVar182._24_4_ = 0x7fffffff;
  auVar182._28_4_ = 0x7fffffff;
  auVar106 = vandps_avx(auVar182,ZEXT1632(auVar94));
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar176._16_4_ = 0x219392ef;
  auVar176._20_4_ = 0x219392ef;
  auVar176._24_4_ = 0x219392ef;
  auVar176._28_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar106,auVar176,1);
  bVar90 = (bool)((byte)uVar88 & 1);
  auVar100._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._0_4_;
  bVar90 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._4_4_;
  bVar90 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._8_4_;
  bVar90 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(auVar182,ZEXT1632(auVar92));
  uVar88 = vcmpps_avx512vl(auVar106,auVar176,1);
  bVar90 = (bool)((byte)uVar88 & 1);
  auVar101._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar92._0_4_;
  bVar90 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar92._4_4_;
  bVar90 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar92._8_4_;
  bVar90 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar92._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar106 = vandps_avx(auVar182,ZEXT1632(auVar98));
  uVar88 = vcmpps_avx512vl(auVar106,auVar176,1);
  bVar90 = (bool)((byte)uVar88 & 1);
  auVar106._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar98._0_4_;
  bVar90 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar98._4_4_;
  bVar90 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar98._8_4_;
  bVar90 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar98._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar105 = vrcp14ps_avx512vl(auVar100);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = &DAT_3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar177._16_4_ = 0x3f800000;
  auVar177._20_4_ = 0x3f800000;
  auVar177._24_4_ = 0x3f800000;
  auVar177._28_4_ = 0x3f800000;
  auVar94 = vfnmadd213ps_fma(auVar100,auVar105,auVar177);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar101);
  auVar92 = vfnmadd213ps_fma(auVar101,auVar105,auVar177);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar106);
  auVar98 = vfnmadd213ps_fma(auVar106,auVar105,auVar177);
  auVar98 = vfmadd132ps_fma(ZEXT1632(auVar98),auVar105,auVar105);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar197));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar107._4_4_ = auVar94._4_4_ * auVar106._4_4_;
  auVar107._0_4_ = auVar94._0_4_ * auVar106._0_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar106._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar106._12_4_;
  auVar107._16_4_ = auVar106._16_4_ * 0.0;
  auVar107._20_4_ = auVar106._20_4_ * 0.0;
  auVar107._24_4_ = auVar106._24_4_ * 0.0;
  auVar107._28_4_ = auVar106._28_4_;
  auVar106 = vcvtdq2ps_avx(auVar105);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar197));
  auVar111._0_4_ = auVar94._0_4_ * auVar106._0_4_;
  auVar111._4_4_ = auVar94._4_4_ * auVar106._4_4_;
  auVar111._8_4_ = auVar94._8_4_ * auVar106._8_4_;
  auVar111._12_4_ = auVar94._12_4_ * auVar106._12_4_;
  auVar111._16_4_ = auVar106._16_4_ * 0.0;
  auVar111._20_4_ = auVar106._20_4_ * 0.0;
  auVar111._24_4_ = auVar106._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar80 * -2 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar6));
  auVar108._4_4_ = auVar92._4_4_ * auVar106._4_4_;
  auVar108._0_4_ = auVar92._0_4_ * auVar106._0_4_;
  auVar108._8_4_ = auVar92._8_4_ * auVar106._8_4_;
  auVar108._12_4_ = auVar92._12_4_ * auVar106._12_4_;
  auVar108._16_4_ = auVar106._16_4_ * 0.0;
  auVar108._20_4_ = auVar106._20_4_ * 0.0;
  auVar108._24_4_ = auVar106._24_4_ * 0.0;
  auVar108._28_4_ = auVar106._28_4_;
  auVar106 = vcvtdq2ps_avx(auVar105);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar6));
  auVar109._0_4_ = auVar92._0_4_ * auVar106._0_4_;
  auVar109._4_4_ = auVar92._4_4_ * auVar106._4_4_;
  auVar109._8_4_ = auVar92._8_4_ * auVar106._8_4_;
  auVar109._12_4_ = auVar92._12_4_ * auVar106._12_4_;
  auVar109._16_4_ = auVar106._16_4_ * 0.0;
  auVar109._20_4_ = auVar106._20_4_ * 0.0;
  auVar109._24_4_ = auVar106._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 + uVar80 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar7));
  auVar112._4_4_ = auVar106._4_4_ * auVar98._4_4_;
  auVar112._0_4_ = auVar106._0_4_ * auVar98._0_4_;
  auVar112._8_4_ = auVar106._8_4_ * auVar98._8_4_;
  auVar112._12_4_ = auVar106._12_4_ * auVar98._12_4_;
  auVar112._16_4_ = auVar106._16_4_ * 0.0;
  auVar112._20_4_ = auVar106._20_4_ * 0.0;
  auVar112._24_4_ = auVar106._24_4_ * 0.0;
  auVar112._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar7));
  auVar102._0_4_ = auVar98._0_4_ * auVar106._0_4_;
  auVar102._4_4_ = auVar98._4_4_ * auVar106._4_4_;
  auVar102._8_4_ = auVar98._8_4_ * auVar106._8_4_;
  auVar102._12_4_ = auVar98._12_4_ * auVar106._12_4_;
  auVar102._16_4_ = auVar106._16_4_ * 0.0;
  auVar102._20_4_ = auVar106._20_4_ * 0.0;
  auVar102._24_4_ = auVar106._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar106 = vpminsd_avx2(auVar107,auVar111);
  auVar105 = vpminsd_avx2(auVar108,auVar109);
  auVar106 = vmaxps_avx(auVar106,auVar105);
  auVar105 = vpminsd_avx2(auVar112,auVar102);
  uVar144 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar115._4_4_ = uVar144;
  auVar115._0_4_ = uVar144;
  auVar115._8_4_ = uVar144;
  auVar115._12_4_ = uVar144;
  auVar115._16_4_ = uVar144;
  auVar115._20_4_ = uVar144;
  auVar115._24_4_ = uVar144;
  auVar115._28_4_ = uVar144;
  auVar105 = vmaxps_avx512vl(auVar105,auVar115);
  auVar106 = vmaxps_avx(auVar106,auVar105);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  auVar105._16_4_ = 0x3f7ffffa;
  auVar105._20_4_ = 0x3f7ffffa;
  auVar105._24_4_ = 0x3f7ffffa;
  auVar105._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar106,auVar105);
  auVar178 = ZEXT3264(local_80);
  auVar106 = vpmaxsd_avx2(auVar107,auVar111);
  auVar155 = ZEXT3264(auVar106);
  auVar105 = vpmaxsd_avx2(auVar108,auVar109);
  auVar106 = vminps_avx(auVar106,auVar105);
  auVar105 = vpmaxsd_avx2(auVar112,auVar102);
  fVar157 = ray->tfar;
  auVar116._4_4_ = fVar157;
  auVar116._0_4_ = fVar157;
  auVar116._8_4_ = fVar157;
  auVar116._12_4_ = fVar157;
  auVar116._16_4_ = fVar157;
  auVar116._20_4_ = fVar157;
  auVar116._24_4_ = fVar157;
  auVar116._28_4_ = fVar157;
  auVar105 = vminps_avx512vl(auVar105,auVar116);
  auVar106 = vminps_avx(auVar106,auVar105);
  auVar114._8_4_ = 0x3f800003;
  auVar114._0_8_ = 0x3f8000033f800003;
  auVar114._12_4_ = 0x3f800003;
  auVar114._16_4_ = 0x3f800003;
  auVar114._20_4_ = 0x3f800003;
  auVar114._24_4_ = 0x3f800003;
  auVar114._28_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar114);
  auVar105 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar105,_DAT_0205a920);
  uVar81 = vcmpps_avx512vl(local_80,auVar106,2);
  bVar90 = (byte)((byte)uVar81 & (byte)uVar21) != 0;
  if (bVar90) {
    uVar88 = (ulong)(byte)((byte)uVar81 & (byte)uVar21);
    pPVar86 = prim;
    local_648 = pre;
    do {
      auVar105 = auVar178._0_32_;
      auVar106 = auVar155._0_32_;
      local_4a0 = in_ZMM21._0_32_;
      local_480 = in_ZMM20._0_32_;
      lVar22 = 0;
      for (uVar80 = uVar88; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar88 = uVar88 - 1 & uVar88;
      local_664 = *(undefined4 *)(pPVar86 + lVar22 * 4 + 6);
      uVar80 = (ulong)(uint)((int)lVar22 << 6);
      local_628 = (ulong)*(uint *)(pPVar86 + 2);
      pGVar11 = (context->scene->geometries).items[local_628].ptr;
      local_660 = *(undefined1 (*) [16])(prim + uVar80 + lVar72 + 0x16);
      if (uVar88 != 0) {
        uVar82 = uVar88 - 1 & uVar88;
        for (uVar84 = uVar88; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        }
        if (uVar82 != 0) {
          for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_3f0 = *(undefined1 (*) [16])(prim + uVar80 + lVar72 + 0x26);
      local_400 = *(undefined1 (*) [16])(prim + uVar80 + lVar72 + 0x36);
      local_410 = *(undefined1 (*) [16])(prim + uVar80 + lVar72 + 0x46);
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->org).field_0;
      auVar92 = vsubps_avx512vl(local_660,(undefined1  [16])aVar3);
      uVar144 = auVar92._0_4_;
      auVar96._4_4_ = uVar144;
      auVar96._0_4_ = uVar144;
      auVar96._8_4_ = uVar144;
      auVar96._12_4_ = uVar144;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar157 = (pre->ray_space).vz.field_0.m128[0];
      fVar149 = (pre->ray_space).vz.field_0.m128[1];
      fVar162 = (pre->ray_space).vz.field_0.m128[2];
      fVar171 = (pre->ray_space).vz.field_0.m128[3];
      auVar181._0_4_ = auVar92._0_4_ * fVar157;
      auVar181._4_4_ = auVar92._4_4_ * fVar149;
      auVar181._8_4_ = auVar92._8_4_ * fVar162;
      auVar181._12_4_ = auVar92._12_4_ * fVar171;
      auVar94 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar94);
      auVar98 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar96);
      auVar93 = vshufps_avx512vl(local_660,local_660,0xff);
      auVar92 = vsubps_avx(local_3f0,(undefined1  [16])aVar3);
      uVar144 = auVar92._0_4_;
      auVar158._4_4_ = uVar144;
      auVar158._0_4_ = uVar144;
      auVar158._8_4_ = uVar144;
      auVar158._12_4_ = uVar144;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar184._0_4_ = auVar92._0_4_ * fVar157;
      auVar184._4_4_ = auVar92._4_4_ * fVar149;
      auVar184._8_4_ = auVar92._8_4_ * fVar162;
      auVar184._12_4_ = auVar92._12_4_ * fVar171;
      auVar94 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar94);
      auVar197 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar158);
      auVar92 = vsubps_avx512vl(local_400,(undefined1  [16])aVar3);
      uVar144 = auVar92._0_4_;
      auVar97._4_4_ = uVar144;
      auVar97._0_4_ = uVar144;
      auVar97._8_4_ = uVar144;
      auVar97._12_4_ = uVar144;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar186._0_4_ = auVar92._0_4_ * fVar157;
      auVar186._4_4_ = auVar92._4_4_ * fVar149;
      auVar186._8_4_ = auVar92._8_4_ * fVar162;
      auVar186._12_4_ = auVar92._12_4_ * fVar171;
      auVar94 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar94);
      auVar6 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar97);
      auVar92 = vsubps_avx512vl(local_410,(undefined1  [16])aVar3);
      uVar144 = auVar92._0_4_;
      auVar150._4_4_ = uVar144;
      auVar150._0_4_ = uVar144;
      auVar150._8_4_ = uVar144;
      auVar150._12_4_ = uVar144;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar187._0_4_ = auVar92._0_4_ * fVar157;
      auVar187._4_4_ = auVar92._4_4_ * fVar149;
      auVar187._8_4_ = auVar92._8_4_ * fVar162;
      auVar187._12_4_ = auVar92._12_4_ * fVar171;
      auVar94 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar94);
      auVar7 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar150);
      lVar22 = (long)iVar10 * 0x44;
      auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar144 = auVar98._0_4_;
      local_440._4_4_ = uVar144;
      local_440._0_4_ = uVar144;
      local_440._8_4_ = uVar144;
      local_440._12_4_ = uVar144;
      local_440._16_4_ = uVar144;
      local_440._20_4_ = uVar144;
      local_440._24_4_ = uVar144;
      local_440._28_4_ = uVar144;
      auVar148._8_4_ = 1;
      auVar148._0_8_ = 0x100000001;
      auVar148._12_4_ = 1;
      auVar148._16_4_ = 1;
      auVar148._20_4_ = 1;
      auVar148._24_4_ = 1;
      auVar148._28_4_ = 1;
      local_460 = vpermps_avx512vl(auVar148,ZEXT1632(auVar98));
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      local_540 = vbroadcastss_avx512vl(auVar197);
      local_200 = vpermps_avx2(auVar148,ZEXT1632(auVar197));
      auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar6);
      local_c0 = vpermps_avx512vl(auVar148,ZEXT1632(auVar6));
      auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0xd8c);
      local_e0 = vbroadcastss_avx512vl(auVar7);
      local_100 = vpermps_avx512vl(auVar148,ZEXT1632(auVar7));
      auVar107 = vmulps_avx512vl(local_e0,auVar113);
      auVar108 = vmulps_avx512vl(local_100,auVar113);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,local_540);
      auVar94 = vfmadd231ps_fma(auVar108,auVar116,local_200);
      auVar99 = vfmadd231ps_avx512vl(auVar107,auVar115,local_440);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar115,local_460);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar104 = vmulps_avx512vl(local_e0,auVar103);
      auVar101 = vmulps_avx512vl(local_100,auVar103);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar112,local_a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_540);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_200);
      auVar8 = vfmadd231ps_fma(auVar104,auVar107,local_440);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_460);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar8),auVar99);
      local_580 = vsubps_avx(auVar101,auVar100);
      auVar104 = vmulps_avx512vl(auVar100,auVar102);
      auVar109 = vmulps_avx512vl(auVar99,local_580);
      auVar104 = vsubps_avx512vl(auVar104,auVar109);
      auVar94 = vshufps_avx(local_3f0,local_3f0,0xff);
      uVar81 = auVar93._0_8_;
      local_120._8_8_ = uVar81;
      local_120._0_8_ = uVar81;
      local_120._16_8_ = uVar81;
      local_120._24_8_ = uVar81;
      local_140 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_400,local_400,0xff);
      local_160 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_410,local_410,0xff);
      uVar81 = auVar94._0_8_;
      register0x00001248 = uVar81;
      local_180 = uVar81;
      register0x00001250 = uVar81;
      register0x00001258 = uVar81;
      auVar109 = vmulps_avx512vl(_local_180,auVar113);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_160);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,local_140);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,local_120);
      auVar110 = vmulps_avx512vl(_local_180,auVar103);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,local_160);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,local_140);
      auVar93 = vfmadd231ps_fma(auVar110,auVar107,local_120);
      auVar110 = vmulps_avx512vl(local_580,local_580);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,auVar102);
      auVar111 = vmaxps_avx512vl(auVar109,ZEXT1632(auVar93));
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      auVar110 = vmulps_avx512vl(auVar111,auVar110);
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      uVar81 = vcmpps_avx512vl(auVar104,auVar110,2);
      auVar94 = vblendps_avx(auVar98,local_660,8);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar92 = vandps_avx512vl(auVar94,auVar95);
      auVar94 = vblendps_avx(auVar197,local_3f0,8);
      auVar94 = vandps_avx512vl(auVar94,auVar95);
      auVar92 = vmaxps_avx(auVar92,auVar94);
      auVar94 = vblendps_avx(auVar6,local_400,8);
      auVar96 = vandps_avx512vl(auVar94,auVar95);
      auVar94 = vblendps_avx(auVar7,local_410,8);
      auVar94 = vandps_avx512vl(auVar94,auVar95);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar94 = vmaxps_avx(auVar92,auVar94);
      auVar92 = vmovshdup_avx(auVar94);
      auVar92 = vmaxss_avx(auVar92,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar92);
      local_640._0_16_ = vcvtsi2ss_avx512f(local_410,iVar10);
      auVar188._0_4_ = local_640._0_4_;
      auVar188._4_4_ = auVar188._0_4_;
      auVar188._8_4_ = auVar188._0_4_;
      auVar188._12_4_ = auVar188._0_4_;
      auVar188._16_4_ = auVar188._0_4_;
      auVar188._20_4_ = auVar188._0_4_;
      auVar188._24_4_ = auVar188._0_4_;
      auVar188._28_4_ = auVar188._0_4_;
      uVar21 = vcmpps_avx512vl(auVar188,_DAT_02020f40,0xe);
      local_310 = (byte)uVar81 & (byte)uVar21;
      local_4e0 = auVar94._0_4_ * 4.7683716e-07;
      auVar159._8_4_ = 2;
      auVar159._0_8_ = 0x200000002;
      auVar159._12_4_ = 2;
      auVar159._16_4_ = 2;
      auVar159._20_4_ = 2;
      auVar159._24_4_ = 2;
      auVar159._28_4_ = 2;
      local_1a0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar98));
      local_1c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar197));
      local_1e0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar6));
      auVar104 = vpermps_avx2(auVar159,ZEXT1632(auVar7));
      fVar157 = *(float *)((long)&(ray->org).field_0 + 0xc);
      auVar94 = local_100._0_16_;
      _local_3e0 = ZEXT416((uint)local_4e0);
      if (local_310 == 0) {
        pRVar83 = (RTCIntersectArguments *)0x0;
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar198 = ZEXT1664(auVar94);
        auVar178 = ZEXT3264(auVar105);
        in_ZMM20 = ZEXT3264(local_480);
        auVar155 = ZEXT3264(auVar106);
        in_ZMM21 = ZEXT3264(local_4a0);
        auVar196 = ZEXT3264(local_440);
        auVar195 = ZEXT3264(local_460);
        auVar194 = ZEXT3264(local_540);
      }
      else {
        fStack_4dc = 0.0;
        fStack_4d8 = 0.0;
        fStack_4d4 = 0.0;
        auVar103 = vmulps_avx512vl(auVar104,auVar103);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_1e0,auVar103);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_1c0,auVar112);
        auVar108 = vfmadd213ps_avx512vl(auVar107,local_1a0,auVar108);
        auVar113 = vmulps_avx512vl(auVar104,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_1e0,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar116,local_1c0,auVar114);
        auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar112);
        auVar115 = vmulps_avx512vl(local_e0,auVar107);
        auVar103 = vmulps_avx512vl(local_100,auVar107);
        auVar34._4_4_ = auVar104._4_4_ * auVar107._4_4_;
        auVar34._0_4_ = auVar104._0_4_ * auVar107._0_4_;
        auVar34._8_4_ = auVar104._8_4_ * auVar107._8_4_;
        auVar34._12_4_ = auVar104._12_4_ * auVar107._12_4_;
        auVar34._16_4_ = auVar104._16_4_ * auVar107._16_4_;
        auVar34._20_4_ = auVar104._20_4_ * auVar107._20_4_;
        auVar34._24_4_ = auVar104._24_4_ * auVar107._24_4_;
        auVar34._28_4_ = auVar107._28_4_;
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,local_a0);
        auVar107 = vfmadd231ps_avx512vl(auVar103,auVar113,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar34,local_1e0,auVar113);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar114,local_540);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_200);
        auVar103 = vfmadd231ps_avx512vl(auVar113,local_1c0,auVar114);
        auVar110 = vfmadd231ps_avx512vl(auVar115,auVar116,local_440);
        auVar195 = ZEXT3264(local_460);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,local_460);
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1f9c);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_1a0,auVar116);
        auVar116 = vmulps_avx512vl(local_e0,auVar113);
        auVar111 = vmulps_avx512vl(local_100,auVar113);
        auVar35._4_4_ = auVar104._4_4_ * auVar113._4_4_;
        auVar35._0_4_ = auVar104._0_4_ * auVar113._0_4_;
        auVar35._8_4_ = auVar104._8_4_ * auVar113._8_4_;
        auVar35._12_4_ = auVar104._12_4_ * auVar113._12_4_;
        auVar35._16_4_ = auVar104._16_4_ * auVar113._16_4_;
        auVar35._20_4_ = auVar104._20_4_ * auVar113._20_4_;
        auVar35._24_4_ = auVar104._24_4_ * auVar113._24_4_;
        auVar35._28_4_ = auVar113._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar116,auVar114,local_a0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_c0);
        auVar114 = vfmadd231ps_avx512vl(auVar35,local_1e0,auVar114);
        auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_540);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_200);
        auVar116 = vfmadd231ps_avx512vl(auVar114,local_1c0,auVar116);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar115,local_440);
        auVar113 = vfmadd231ps_avx512vl(auVar111,auVar115,local_460);
        auVar111 = vfmadd231ps_avx512vl(auVar116,local_1a0,auVar115);
        auVar192._8_4_ = 0x7fffffff;
        auVar192._0_8_ = 0x7fffffff7fffffff;
        auVar192._12_4_ = 0x7fffffff;
        auVar192._16_4_ = 0x7fffffff;
        auVar192._20_4_ = 0x7fffffff;
        auVar192._24_4_ = 0x7fffffff;
        auVar192._28_4_ = 0x7fffffff;
        auVar115 = vandps_avx(auVar110,auVar192);
        auVar116 = vandps_avx(auVar107,auVar192);
        auVar116 = vmaxps_avx(auVar115,auVar116);
        auVar115 = vandps_avx(auVar103,auVar192);
        auVar115 = vmaxps_avx(auVar116,auVar115);
        auVar103 = vbroadcastss_avx512vl(_local_3e0);
        uVar80 = vcmpps_avx512vl(auVar115,auVar103,1);
        local_4c0._0_4_ = auVar102._0_4_;
        local_4c0._4_4_ = auVar102._4_4_;
        local_4c0._8_4_ = auVar102._8_4_;
        iStack_4b4 = auVar102._12_4_;
        iStack_4b0 = auVar102._16_4_;
        iStack_4ac = auVar102._20_4_;
        iStack_4a8 = auVar102._24_4_;
        iStack_4a4 = auVar102._28_4_;
        bVar14 = (bool)((byte)uVar80 & 1);
        auVar117._0_4_ = (float)((uint)bVar14 * local_4c0._0_4_ | (uint)!bVar14 * auVar110._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar14 * local_4c0._4_4_ | (uint)!bVar14 * auVar110._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar14 * local_4c0._8_4_ | (uint)!bVar14 * auVar110._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar14 * iStack_4b4 | (uint)!bVar14 * auVar110._12_4_);
        bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar14 * iStack_4b0 | (uint)!bVar14 * auVar110._16_4_);
        bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar14 * iStack_4ac | (uint)!bVar14 * auVar110._20_4_);
        bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar14 * iStack_4a8 | (uint)!bVar14 * auVar110._24_4_);
        bVar14 = SUB81(uVar80 >> 7,0);
        auVar117._28_4_ = (uint)bVar14 * iStack_4a4 | (uint)!bVar14 * auVar110._28_4_;
        bVar14 = (bool)((byte)uVar80 & 1);
        auVar118._0_4_ = (float)((uint)bVar14 * local_580._0_4_ | (uint)!bVar14 * auVar107._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar14 * local_580._4_4_ | (uint)!bVar14 * auVar107._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar14 * local_580._8_4_ | (uint)!bVar14 * auVar107._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar14 * local_580._12_4_ | (uint)!bVar14 * auVar107._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar14 * local_580._16_4_ | (uint)!bVar14 * auVar107._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar14 * local_580._20_4_ | (uint)!bVar14 * auVar107._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar14 * local_580._24_4_ | (uint)!bVar14 * auVar107._24_4_)
        ;
        bVar14 = SUB81(uVar80 >> 7,0);
        auVar118._28_4_ = (uint)bVar14 * local_580._28_4_ | (uint)!bVar14 * auVar107._28_4_;
        auVar115 = vandps_avx(auVar192,auVar114);
        auVar116 = vandps_avx(auVar113,auVar192);
        auVar116 = vmaxps_avx(auVar115,auVar116);
        auVar115 = vandps_avx(auVar111,auVar192);
        auVar115 = vmaxps_avx(auVar116,auVar115);
        uVar80 = vcmpps_avx512vl(auVar115,auVar103,1);
        bVar14 = (bool)((byte)uVar80 & 1);
        auVar119._0_4_ = (float)((uint)bVar14 * local_4c0._0_4_ | (uint)!bVar14 * auVar114._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar14 * local_4c0._4_4_ | (uint)!bVar14 * auVar114._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar14 * local_4c0._8_4_ | (uint)!bVar14 * auVar114._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar14 * iStack_4b4 | (uint)!bVar14 * auVar114._12_4_);
        bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar14 * iStack_4b0 | (uint)!bVar14 * auVar114._16_4_);
        bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar14 * iStack_4ac | (uint)!bVar14 * auVar114._20_4_);
        bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar14 * iStack_4a8 | (uint)!bVar14 * auVar114._24_4_);
        bVar14 = SUB81(uVar80 >> 7,0);
        auVar119._28_4_ = (uint)bVar14 * iStack_4a4 | (uint)!bVar14 * auVar114._28_4_;
        bVar14 = (bool)((byte)uVar80 & 1);
        auVar120._0_4_ = (float)((uint)bVar14 * local_580._0_4_ | (uint)!bVar14 * auVar113._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar14 * local_580._4_4_ | (uint)!bVar14 * auVar113._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar14 * local_580._8_4_ | (uint)!bVar14 * auVar113._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar14 * local_580._12_4_ | (uint)!bVar14 * auVar113._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar14 * local_580._16_4_ | (uint)!bVar14 * auVar113._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar14 * local_580._20_4_ | (uint)!bVar14 * auVar113._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar14 * local_580._24_4_ | (uint)!bVar14 * auVar113._24_4_)
        ;
        bVar14 = SUB81(uVar80 >> 7,0);
        auVar120._28_4_ = (uint)bVar14 * local_580._28_4_ | (uint)!bVar14 * auVar113._28_4_;
        auVar97 = vxorps_avx512vl(auVar94,auVar94);
        auVar198 = ZEXT1664(auVar97);
        auVar115 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar97));
        auVar94 = vfmadd231ps_fma(auVar115,auVar118,auVar118);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar149 = auVar115._0_4_;
        fVar162 = auVar115._4_4_;
        fVar171 = auVar115._8_4_;
        fVar172 = auVar115._12_4_;
        fVar173 = auVar115._16_4_;
        fVar161 = auVar115._20_4_;
        fVar91 = auVar115._24_4_;
        auVar36._4_4_ = fVar162 * fVar162 * fVar162 * auVar94._4_4_ * -0.5;
        auVar36._0_4_ = fVar149 * fVar149 * fVar149 * auVar94._0_4_ * -0.5;
        auVar36._8_4_ = fVar171 * fVar171 * fVar171 * auVar94._8_4_ * -0.5;
        auVar36._12_4_ = fVar172 * fVar172 * fVar172 * auVar94._12_4_ * -0.5;
        auVar36._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar36._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar36._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar36._28_4_ = 0;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar36,auVar116,auVar115);
        auVar37._4_4_ = auVar118._4_4_ * auVar114._4_4_;
        auVar37._0_4_ = auVar118._0_4_ * auVar114._0_4_;
        auVar37._8_4_ = auVar118._8_4_ * auVar114._8_4_;
        auVar37._12_4_ = auVar118._12_4_ * auVar114._12_4_;
        auVar37._16_4_ = auVar118._16_4_ * auVar114._16_4_;
        auVar37._20_4_ = auVar118._20_4_ * auVar114._20_4_;
        auVar37._24_4_ = auVar118._24_4_ * auVar114._24_4_;
        auVar37._28_4_ = auVar115._28_4_;
        auVar38._4_4_ = auVar114._4_4_ * -auVar117._4_4_;
        auVar38._0_4_ = auVar114._0_4_ * -auVar117._0_4_;
        auVar38._8_4_ = auVar114._8_4_ * -auVar117._8_4_;
        auVar38._12_4_ = auVar114._12_4_ * -auVar117._12_4_;
        auVar38._16_4_ = auVar114._16_4_ * -auVar117._16_4_;
        auVar38._20_4_ = auVar114._20_4_ * -auVar117._20_4_;
        auVar38._24_4_ = auVar114._24_4_ * -auVar117._24_4_;
        auVar38._28_4_ = auVar117._28_4_ ^ 0x80000000;
        auVar115 = vmulps_avx512vl(auVar114,ZEXT1632(auVar97));
        auVar110 = ZEXT1632(auVar97);
        auVar113 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar110);
        auVar94 = vfmadd231ps_fma(auVar113,auVar120,auVar120);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar149 = auVar113._0_4_;
        fVar162 = auVar113._4_4_;
        fVar171 = auVar113._8_4_;
        fVar172 = auVar113._12_4_;
        fVar173 = auVar113._16_4_;
        fVar161 = auVar113._20_4_;
        fVar91 = auVar113._24_4_;
        auVar39._4_4_ = fVar162 * fVar162 * fVar162 * auVar94._4_4_ * -0.5;
        auVar39._0_4_ = fVar149 * fVar149 * fVar149 * auVar94._0_4_ * -0.5;
        auVar39._8_4_ = fVar171 * fVar171 * fVar171 * auVar94._8_4_ * -0.5;
        auVar39._12_4_ = fVar172 * fVar172 * fVar172 * auVar94._12_4_ * -0.5;
        auVar39._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar39._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar39._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar39._28_4_ = 0;
        auVar116 = vfmadd231ps_avx512vl(auVar39,auVar116,auVar113);
        auVar40._4_4_ = auVar120._4_4_ * auVar116._4_4_;
        auVar40._0_4_ = auVar120._0_4_ * auVar116._0_4_;
        auVar40._8_4_ = auVar120._8_4_ * auVar116._8_4_;
        auVar40._12_4_ = auVar120._12_4_ * auVar116._12_4_;
        auVar40._16_4_ = auVar120._16_4_ * auVar116._16_4_;
        auVar40._20_4_ = auVar120._20_4_ * auVar116._20_4_;
        auVar40._24_4_ = auVar120._24_4_ * auVar116._24_4_;
        auVar40._28_4_ = auVar113._28_4_;
        auVar41._4_4_ = -auVar119._4_4_ * auVar116._4_4_;
        auVar41._0_4_ = -auVar119._0_4_ * auVar116._0_4_;
        auVar41._8_4_ = -auVar119._8_4_ * auVar116._8_4_;
        auVar41._12_4_ = -auVar119._12_4_ * auVar116._12_4_;
        auVar41._16_4_ = -auVar119._16_4_ * auVar116._16_4_;
        auVar41._20_4_ = -auVar119._20_4_ * auVar116._20_4_;
        auVar41._24_4_ = -auVar119._24_4_ * auVar116._24_4_;
        auVar41._28_4_ = auVar114._28_4_;
        auVar116 = vmulps_avx512vl(auVar116,auVar110);
        auVar94 = vfmadd213ps_fma(auVar37,auVar109,auVar99);
        auVar92 = vfmadd213ps_fma(auVar38,auVar109,auVar100);
        auVar114 = vfmadd213ps_avx512vl(auVar115,auVar109,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar93),ZEXT1632(auVar8));
        auVar95 = vfnmadd213ps_fma(auVar37,auVar109,auVar99);
        auVar103 = ZEXT1632(auVar93);
        auVar98 = vfmadd213ps_fma(auVar41,auVar103,auVar101);
        auVar96 = vfnmadd213ps_fma(auVar38,auVar109,auVar100);
        auVar197 = vfmadd213ps_fma(auVar116,auVar103,auVar108);
        auVar107 = vfnmadd231ps_avx512vl(auVar112,auVar109,auVar115);
        auVar8 = vfnmadd213ps_fma(auVar40,auVar103,ZEXT1632(auVar8));
        auVar150 = vfnmadd213ps_fma(auVar41,auVar103,auVar101);
        auVar158 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar93),auVar116);
        auVar116 = vsubps_avx512vl(auVar113,ZEXT1632(auVar95));
        auVar115 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar96));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar197),auVar107);
        auVar112 = vmulps_avx512vl(auVar115,auVar107);
        auVar6 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar96),auVar108);
        auVar42._4_4_ = auVar95._4_4_ * auVar108._4_4_;
        auVar42._0_4_ = auVar95._0_4_ * auVar108._0_4_;
        auVar42._8_4_ = auVar95._8_4_ * auVar108._8_4_;
        auVar42._12_4_ = auVar95._12_4_ * auVar108._12_4_;
        auVar42._16_4_ = auVar108._16_4_ * 0.0;
        auVar42._20_4_ = auVar108._20_4_ * 0.0;
        auVar42._24_4_ = auVar108._24_4_ * 0.0;
        auVar42._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar42,auVar107,auVar116);
        auVar43._4_4_ = auVar96._4_4_ * auVar116._4_4_;
        auVar43._0_4_ = auVar96._0_4_ * auVar116._0_4_;
        auVar43._8_4_ = auVar96._8_4_ * auVar116._8_4_;
        auVar43._12_4_ = auVar96._12_4_ * auVar116._12_4_;
        auVar43._16_4_ = auVar116._16_4_ * 0.0;
        auVar43._20_4_ = auVar116._20_4_ * 0.0;
        auVar43._24_4_ = auVar116._24_4_ * 0.0;
        auVar43._28_4_ = auVar116._28_4_;
        auVar7 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar95),auVar115);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar110,auVar108);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,ZEXT1632(auVar6));
        auVar110 = ZEXT1632(auVar97);
        uVar80 = vcmpps_avx512vl(auVar115,auVar110,2);
        bVar13 = (byte)uVar80;
        fVar91 = (float)((uint)(bVar13 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar8._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        fVar136 = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar8._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        fVar138 = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar8._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        fVar140 = (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar8._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar91))));
        fVar156 = (float)((uint)(bVar13 & 1) * auVar92._0_4_ |
                         (uint)!(bool)(bVar13 & 1) * auVar150._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        fVar137 = (float)((uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar150._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        fVar139 = (float)((uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar150._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        fVar141 = (float)((uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar150._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar156))));
        auVar121._0_4_ =
             (float)((uint)(bVar13 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar13 & 1) * auVar158._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar158._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar158._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar158._12_4_);
        fVar162 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar114._16_4_);
        auVar121._16_4_ = fVar162;
        fVar149 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar114._20_4_);
        auVar121._20_4_ = fVar149;
        fVar171 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar114._24_4_);
        auVar121._24_4_ = fVar171;
        iVar1 = (uint)(byte)(uVar80 >> 7) * auVar114._28_4_;
        auVar121._28_4_ = iVar1;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar95),auVar113);
        auVar122._0_4_ =
             (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_;
        auVar122._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar98));
        auVar123._0_4_ =
             (float)((uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar92._0_4_
                    );
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar92._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar92._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar92._12_4_);
        fVar172 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_);
        auVar123._16_4_ = fVar172;
        fVar173 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_);
        auVar123._20_4_ = fVar173;
        fVar161 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_);
        auVar123._24_4_ = fVar161;
        auVar123._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar197));
        auVar124._0_4_ =
             (float)((uint)(bVar13 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar13 & 1) * auVar114._0_4_);
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar114._4_4_);
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar114._8_4_);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar114._12_4_);
        bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * auVar114._16_4_);
        bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * auVar114._20_4_);
        bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * auVar114._24_4_);
        bVar14 = SUB81(uVar80 >> 7,0);
        auVar124._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * auVar114._28_4_;
        auVar125._0_4_ =
             (uint)(bVar13 & 1) * (int)auVar95._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar113._0_4_;
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar14 * (int)auVar95._4_4_ | (uint)!bVar14 * auVar113._4_4_;
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar14 * (int)auVar95._8_4_ | (uint)!bVar14 * auVar113._8_4_;
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar14 * (int)auVar95._12_4_ | (uint)!bVar14 * auVar113._12_4_;
        auVar125._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar113._16_4_;
        auVar125._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar113._20_4_;
        auVar125._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar113._24_4_;
        auVar125._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar113._28_4_;
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar126._0_4_ =
             (uint)(bVar13 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar197._0_4_;
        bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar197._4_4_;
        bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar197._8_4_;
        bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar197._12_4_;
        auVar126._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar107._16_4_;
        auVar126._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar107._20_4_;
        auVar126._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar107._24_4_;
        iVar2 = (uint)(byte)(uVar80 >> 7) * auVar107._28_4_;
        auVar126._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar125,auVar112);
        auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar96._12_4_ |
                                                 (uint)!bVar17 * auVar98._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar96._8_4_ |
                                                          (uint)!bVar16 * auVar98._8_4_,
                                                          CONCAT44((uint)bVar14 * (int)auVar96._4_4_
                                                                   | (uint)!bVar14 * auVar98._4_4_,
                                                                   (uint)(bVar13 & 1) *
                                                                   (int)auVar96._0_4_ |
                                                                   (uint)!(bool)(bVar13 & 1) *
                                                                   auVar98._0_4_)))),auVar103);
        auVar114 = vsubps_avx(auVar126,auVar121);
        auVar113 = vsubps_avx(auVar112,auVar122);
        auVar107 = vsubps_avx(auVar103,auVar123);
        auVar108 = vsubps_avx(auVar121,auVar124);
        auVar44._4_4_ = auVar114._4_4_ * fVar136;
        auVar44._0_4_ = auVar114._0_4_ * fVar91;
        auVar44._8_4_ = auVar114._8_4_ * fVar138;
        auVar44._12_4_ = auVar114._12_4_ * fVar140;
        auVar44._16_4_ = auVar114._16_4_ * 0.0;
        auVar44._20_4_ = auVar114._20_4_ * 0.0;
        auVar44._24_4_ = auVar114._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar44,auVar121,auVar99);
        auVar45._4_4_ = fVar137 * auVar99._4_4_;
        auVar45._0_4_ = fVar156 * auVar99._0_4_;
        auVar45._8_4_ = fVar139 * auVar99._8_4_;
        auVar45._12_4_ = fVar141 * auVar99._12_4_;
        auVar45._16_4_ = auVar99._16_4_ * 0.0;
        auVar45._20_4_ = auVar99._20_4_ * 0.0;
        auVar45._24_4_ = auVar99._24_4_ * 0.0;
        auVar45._28_4_ = auVar115._28_4_;
        auVar92 = vfmsub231ps_fma(auVar45,auVar112,auVar116);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar110,ZEXT1632(auVar94));
        auVar167._0_4_ = auVar116._0_4_ * auVar121._0_4_;
        auVar167._4_4_ = auVar116._4_4_ * auVar121._4_4_;
        auVar167._8_4_ = auVar116._8_4_ * auVar121._8_4_;
        auVar167._12_4_ = auVar116._12_4_ * auVar121._12_4_;
        auVar167._16_4_ = auVar116._16_4_ * fVar162;
        auVar167._20_4_ = auVar116._20_4_ * fVar149;
        auVar167._24_4_ = auVar116._24_4_ * fVar171;
        auVar167._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar167,auVar103,auVar114);
        auVar100 = vfmadd231ps_avx512vl(auVar115,auVar110,ZEXT1632(auVar94));
        auVar115 = vmulps_avx512vl(auVar108,auVar122);
        auVar115 = vfmsub231ps_avx512vl(auVar115,auVar113,auVar124);
        auVar46._4_4_ = auVar107._4_4_ * auVar124._4_4_;
        auVar46._0_4_ = auVar107._0_4_ * auVar124._0_4_;
        auVar46._8_4_ = auVar107._8_4_ * auVar124._8_4_;
        auVar46._12_4_ = auVar107._12_4_ * auVar124._12_4_;
        auVar46._16_4_ = auVar107._16_4_ * auVar124._16_4_;
        auVar46._20_4_ = auVar107._20_4_ * auVar124._20_4_;
        auVar46._24_4_ = auVar107._24_4_ * auVar124._24_4_;
        auVar46._28_4_ = auVar124._28_4_;
        auVar94 = vfmsub231ps_fma(auVar46,auVar123,auVar108);
        auVar168._0_4_ = auVar123._0_4_ * auVar113._0_4_;
        auVar168._4_4_ = auVar123._4_4_ * auVar113._4_4_;
        auVar168._8_4_ = auVar123._8_4_ * auVar113._8_4_;
        auVar168._12_4_ = auVar123._12_4_ * auVar113._12_4_;
        auVar168._16_4_ = fVar172 * auVar113._16_4_;
        auVar168._20_4_ = fVar173 * auVar113._20_4_;
        auVar168._24_4_ = fVar161 * auVar113._24_4_;
        auVar168._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar168,auVar107,auVar122);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar110,auVar115);
        auVar101 = vfmadd231ps_avx512vl(auVar115,auVar110,ZEXT1632(auVar94));
        auVar115 = vmaxps_avx(auVar100,auVar101);
        uVar81 = vcmpps_avx512vl(auVar115,auVar110,2);
        local_310 = local_310 & (byte)uVar81;
        in_ZMM20 = ZEXT3264(local_480);
        in_ZMM21 = ZEXT3264(local_4a0);
        auVar196 = ZEXT3264(local_440);
        auVar194 = ZEXT3264(local_540);
        auVar191 = ZEXT1664(_local_3e0);
        if (local_310 == 0) {
          local_310 = 0;
          auVar178 = ZEXT3264(auVar105);
          auVar155 = ZEXT3264(auVar106);
        }
        else {
          auVar47._4_4_ = auVar108._4_4_ * auVar116._4_4_;
          auVar47._0_4_ = auVar108._0_4_ * auVar116._0_4_;
          auVar47._8_4_ = auVar108._8_4_ * auVar116._8_4_;
          auVar47._12_4_ = auVar108._12_4_ * auVar116._12_4_;
          auVar47._16_4_ = auVar108._16_4_ * auVar116._16_4_;
          auVar47._20_4_ = auVar108._20_4_ * auVar116._20_4_;
          auVar47._24_4_ = auVar108._24_4_ * auVar116._24_4_;
          auVar47._28_4_ = auVar115._28_4_;
          auVar98 = vfmsub231ps_fma(auVar47,auVar107,auVar114);
          auVar48._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar48._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar48._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar48._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar48._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar48._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar48._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar48._28_4_ = auVar114._28_4_;
          auVar92 = vfmsub231ps_fma(auVar48,auVar99,auVar108);
          auVar49._4_4_ = auVar107._4_4_ * auVar99._4_4_;
          auVar49._0_4_ = auVar107._0_4_ * auVar99._0_4_;
          auVar49._8_4_ = auVar107._8_4_ * auVar99._8_4_;
          auVar49._12_4_ = auVar107._12_4_ * auVar99._12_4_;
          auVar49._16_4_ = auVar107._16_4_ * auVar99._16_4_;
          auVar49._20_4_ = auVar107._20_4_ * auVar99._20_4_;
          auVar49._24_4_ = auVar107._24_4_ * auVar99._24_4_;
          auVar49._28_4_ = auVar107._28_4_;
          auVar197 = vfmsub231ps_fma(auVar49,auVar113,auVar116);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar197));
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar98),auVar110);
          auVar116 = vrcp14ps_avx512vl(auVar115);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar114 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar25);
          auVar94 = vfmadd132ps_fma(auVar114,auVar116,auVar116);
          auVar50._4_4_ = auVar197._4_4_ * auVar121._4_4_;
          auVar50._0_4_ = auVar197._0_4_ * auVar121._0_4_;
          auVar50._8_4_ = auVar197._8_4_ * auVar121._8_4_;
          auVar50._12_4_ = auVar197._12_4_ * auVar121._12_4_;
          auVar50._16_4_ = fVar162 * 0.0;
          auVar50._20_4_ = fVar149 * 0.0;
          auVar50._24_4_ = fVar171 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar92 = vfmadd231ps_fma(auVar50,auVar103,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar112,ZEXT1632(auVar98));
          fVar162 = auVar94._0_4_;
          fVar171 = auVar94._4_4_;
          fVar172 = auVar94._8_4_;
          fVar173 = auVar94._12_4_;
          auVar116 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar173,
                                        CONCAT48(auVar92._8_4_ * fVar172,
                                                 CONCAT44(auVar92._4_4_ * fVar171,
                                                          auVar92._0_4_ * fVar162))));
          auVar155 = ZEXT3264(auVar116);
          auVar179._4_4_ = fVar157;
          auVar179._0_4_ = fVar157;
          auVar179._8_4_ = fVar157;
          auVar179._12_4_ = fVar157;
          auVar179._16_4_ = fVar157;
          auVar179._20_4_ = fVar157;
          auVar179._24_4_ = fVar157;
          auVar179._28_4_ = fVar157;
          uVar81 = vcmpps_avx512vl(auVar179,auVar116,2);
          fVar149 = ray->tfar;
          auVar26._4_4_ = fVar149;
          auVar26._0_4_ = fVar149;
          auVar26._8_4_ = fVar149;
          auVar26._12_4_ = fVar149;
          auVar26._16_4_ = fVar149;
          auVar26._20_4_ = fVar149;
          auVar26._24_4_ = fVar149;
          auVar26._28_4_ = fVar149;
          uVar21 = vcmpps_avx512vl(auVar116,auVar26,2);
          local_310 = (byte)uVar81 & (byte)uVar21 & local_310;
          if (local_310 == 0) {
            local_310 = 0;
            auVar178 = ZEXT3264(auVar105);
            auVar155 = ZEXT3264(auVar106);
          }
          else {
            uVar81 = vcmpps_avx512vl(auVar115,auVar110,4);
            if ((local_310 & (byte)uVar81) == 0) {
              local_310 = 0;
              auVar178 = ZEXT3264(auVar105);
              auVar155 = ZEXT3264(auVar106);
            }
            else {
              local_310 = local_310 & (byte)uVar81;
              fVar149 = auVar100._0_4_ * fVar162;
              fVar161 = auVar100._4_4_ * fVar171;
              auVar51._4_4_ = fVar161;
              auVar51._0_4_ = fVar149;
              fVar91 = auVar100._8_4_ * fVar172;
              auVar51._8_4_ = fVar91;
              fVar156 = auVar100._12_4_ * fVar173;
              auVar51._12_4_ = fVar156;
              fVar136 = auVar100._16_4_ * 0.0;
              auVar51._16_4_ = fVar136;
              fVar137 = auVar100._20_4_ * 0.0;
              auVar51._20_4_ = fVar137;
              fVar138 = auVar100._24_4_ * 0.0;
              auVar51._24_4_ = fVar138;
              auVar51._28_4_ = auVar100._28_4_;
              fVar162 = auVar101._0_4_ * fVar162;
              fVar171 = auVar101._4_4_ * fVar171;
              auVar52._4_4_ = fVar171;
              auVar52._0_4_ = fVar162;
              fVar172 = auVar101._8_4_ * fVar172;
              auVar52._8_4_ = fVar172;
              fVar173 = auVar101._12_4_ * fVar173;
              auVar52._12_4_ = fVar173;
              fVar139 = auVar101._16_4_ * 0.0;
              auVar52._16_4_ = fVar139;
              fVar140 = auVar101._20_4_ * 0.0;
              auVar52._20_4_ = fVar140;
              fVar141 = auVar101._24_4_ * 0.0;
              auVar52._24_4_ = fVar141;
              auVar52._28_4_ = auVar101._28_4_;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = &DAT_3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar174,auVar51);
              bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar80 >> 6) & 1);
              bVar20 = SUB81(uVar80 >> 7,0);
              auVar178 = ZEXT3264(CONCAT428((uint)bVar20 * auVar100._28_4_ |
                                            (uint)!bVar20 * auVar106._28_4_,
                                            CONCAT424((uint)bVar19 * (int)fVar138 |
                                                      (uint)!bVar19 * auVar106._24_4_,
                                                      CONCAT420((uint)bVar18 * (int)fVar137 |
                                                                (uint)!bVar18 * auVar106._20_4_,
                                                                CONCAT416((uint)bVar17 *
                                                                          (int)fVar136 |
                                                                          (uint)!bVar17 *
                                                                          auVar106._16_4_,
                                                                          CONCAT412((uint)bVar16 *
                                                                                    (int)fVar156 |
                                                                                    (uint)!bVar16 *
                                                                                    auVar106._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar15 * (int)fVar91 |
                                                  (uint)!bVar15 * auVar106._8_4_,
                                                  CONCAT44((uint)bVar14 * (int)fVar161 |
                                                           (uint)!bVar14 * auVar106._4_4_,
                                                           (uint)(bVar13 & 1) * (int)fVar149 |
                                                           (uint)!(bool)(bVar13 & 1) *
                                                           auVar106._0_4_))))))));
              auVar106 = vsubps_avx(auVar174,auVar52);
              bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar80 >> 6) & 1);
              bVar20 = SUB81(uVar80 >> 7,0);
              local_260._4_4_ = (uint)bVar14 * (int)fVar171 | (uint)!bVar14 * auVar106._4_4_;
              local_260._0_4_ =
                   (uint)(bVar13 & 1) * (int)fVar162 | (uint)!(bool)(bVar13 & 1) * auVar106._0_4_;
              local_260._8_4_ = (uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar106._8_4_;
              local_260._12_4_ = (uint)bVar16 * (int)fVar173 | (uint)!bVar16 * auVar106._12_4_;
              local_260._16_4_ = (uint)bVar17 * (int)fVar139 | (uint)!bVar17 * auVar106._16_4_;
              local_260._20_4_ = (uint)bVar18 * (int)fVar140 | (uint)!bVar18 * auVar106._20_4_;
              local_260._24_4_ = (uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar106._24_4_;
              local_260._28_4_ = (uint)bVar20 * auVar101._28_4_ | (uint)!bVar20 * auVar106._28_4_;
            }
          }
        }
        auVar183 = ZEXT3264(auVar104);
        auVar180 = ZEXT1664(local_660);
        if (local_310 != 0) {
          auVar106 = vsubps_avx(ZEXT1632(auVar93),auVar109);
          local_600 = auVar178._0_32_;
          auVar94 = vfmadd213ps_fma(auVar106,local_600,auVar109);
          fVar149 = pre->depth_scale;
          auVar27._4_4_ = fVar149;
          auVar27._0_4_ = fVar149;
          auVar27._8_4_ = fVar149;
          auVar27._12_4_ = fVar149;
          auVar27._16_4_ = fVar149;
          auVar27._20_4_ = fVar149;
          auVar27._24_4_ = fVar149;
          auVar27._28_4_ = fVar149;
          auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar27)
          ;
          local_620 = auVar155._0_32_;
          uVar81 = vcmpps_avx512vl(local_620,auVar106,6);
          local_310 = local_310 & (byte)uVar81;
          if (local_310 != 0) {
            auVar145._8_4_ = 0xbf800000;
            auVar145._0_8_ = 0xbf800000bf800000;
            auVar145._12_4_ = 0xbf800000;
            auVar145._16_4_ = 0xbf800000;
            auVar145._20_4_ = 0xbf800000;
            auVar145._24_4_ = 0xbf800000;
            auVar145._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_260,auVar145,auVar28);
            local_260 = local_3a0;
            auVar106 = local_260;
            local_360 = 0;
            local_340 = local_3f0._0_8_;
            uStack_338 = local_3f0._8_8_;
            local_330 = local_400._0_8_;
            uStack_328 = local_400._8_8_;
            local_320 = local_410._0_8_;
            uStack_318 = local_410._8_8_;
            if ((pGVar11->mask & ray->mask) != 0) {
              pRVar83 = context->args;
              if ((pRVar83->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar83 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar83 >> 8),1),
                 pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar149 = 1.0 / auVar188._0_4_;
                local_300[0] = fVar149 * (auVar178._0_4_ + 0.0);
                local_300[1] = fVar149 * (auVar178._4_4_ + 1.0);
                local_300[2] = fVar149 * (auVar178._8_4_ + 2.0);
                local_300[3] = fVar149 * (auVar178._12_4_ + 3.0);
                fStack_2f0 = fVar149 * (auVar178._16_4_ + 4.0);
                fStack_2ec = fVar149 * (auVar178._20_4_ + 5.0);
                fStack_2e8 = fVar149 * (auVar178._24_4_ + 6.0);
                fStack_2e4 = auVar178._28_4_ + 7.0;
                local_260._0_8_ = local_3a0._0_8_;
                local_260._8_8_ = local_3a0._8_8_;
                local_260._16_8_ = local_3a0._16_8_;
                local_260._24_8_ = local_3a0._24_8_;
                local_2e0 = local_260._0_8_;
                uStack_2d8 = local_260._8_8_;
                uStack_2d0 = local_260._16_8_;
                uStack_2c8 = local_260._24_8_;
                local_2c0 = local_620;
                uVar80 = CONCAT71(0,local_310);
                local_4f0 = local_3f0._0_8_;
                uStack_4e8 = local_3f0._8_8_;
                stack0xfffffffffffffb48 = auVar102._8_24_;
                local_4c0._0_8_ = uVar80;
                lVar89 = 0;
                for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                  lVar89 = lVar89 + 1;
                }
                local_500 = local_400._0_4_;
                uStack_4fc = local_400._4_4_;
                uStack_4f8 = local_400._8_8_;
                local_550 = (Geometry *)local_410._0_8_;
                uStack_548 = local_410._8_8_;
                uVar80 = CONCAT71((int7)((ulong)pRVar83 >> 8),1);
                local_678 = ray;
                local_670 = context;
                local_650 = pPVar86;
                local_520 = auVar104;
                local_4e0 = fVar157;
                local_3c0 = local_600;
                local_380 = local_620;
                local_35c = iVar10;
                local_350 = local_660;
                local_260 = auVar106;
                do {
                  auVar197 = auVar198._0_16_;
                  local_580._0_4_ = (int)uVar80;
                  local_5a4 = local_300[lVar89];
                  local_5a0 = *(undefined4 *)((long)&local_2e0 + lVar89 * 4);
                  local_680 = CONCAT44(local_680._4_4_,ray->tfar);
                  local_2a0 = (uint)lVar89;
                  uStack_29c = (undefined4)((ulong)lVar89 >> 0x20);
                  ray->tfar = *(float *)(local_2c0 + lVar89 * 4);
                  local_5e0.context = context->user;
                  fVar149 = 1.0 - local_5a4;
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar149),auVar23);
                  auVar94 = ZEXT416((uint)(local_5a4 * fVar149 * 4.0));
                  auVar92 = vfnmsub213ss_fma(ZEXT416((uint)local_5a4),ZEXT416((uint)local_5a4),
                                             auVar94);
                  auVar94 = vfmadd213ss_fma(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),auVar94);
                  fVar149 = fVar149 * auVar98._0_4_ * 0.5;
                  fVar162 = auVar92._0_4_ * 0.5;
                  fVar171 = auVar94._0_4_ * 0.5;
                  fVar172 = local_5a4 * local_5a4 * 0.5;
                  auVar163._0_4_ = fVar172 * (float)local_550;
                  auVar163._4_4_ = fVar172 * local_550._4_4_;
                  auVar163._8_4_ = fVar172 * (float)uStack_548;
                  auVar163._12_4_ = fVar172 * uStack_548._4_4_;
                  auVar151._4_4_ = fVar171;
                  auVar151._0_4_ = fVar171;
                  auVar151._8_4_ = fVar171;
                  auVar151._12_4_ = fVar171;
                  auVar73._4_4_ = uStack_4fc;
                  auVar73._0_4_ = local_500;
                  auVar73._8_8_ = uStack_4f8;
                  auVar94 = vfmadd132ps_fma(auVar151,auVar163,auVar73);
                  auVar164._4_4_ = fVar162;
                  auVar164._0_4_ = fVar162;
                  auVar164._8_4_ = fVar162;
                  auVar164._12_4_ = fVar162;
                  auVar74._8_8_ = uStack_4e8;
                  auVar74._0_8_ = local_4f0;
                  auVar94 = vfmadd132ps_fma(auVar164,auVar94,auVar74);
                  auVar152._4_4_ = fVar149;
                  auVar152._0_4_ = fVar149;
                  auVar152._8_4_ = fVar149;
                  auVar152._12_4_ = fVar149;
                  auVar94 = vfmadd213ps_fma(auVar152,auVar180._0_16_,auVar94);
                  local_5b0 = vmovlps_avx(auVar94);
                  local_5a8 = vextractps_avx(auVar94,2);
                  local_59c = local_664;
                  local_598 = (undefined4)local_628;
                  local_594 = (local_5e0.context)->instID[0];
                  local_590 = (local_5e0.context)->instPrimID[0];
                  local_684 = -1;
                  local_5e0.valid = &local_684;
                  local_5e0.geometryUserPtr = pGVar11->userPtr;
                  local_5e0.hit = (RTCHitN *)&local_5b0;
                  local_5e0.N = 1;
                  local_5e0.ray = (RTCRayN *)ray;
                  if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d5041f:
                    fVar149 = auVar191._0_4_;
                    auVar104 = auVar183._0_32_;
                    auVar94 = auVar198._0_16_;
                    p_Var12 = context->args->filter;
                    if (p_Var12 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var12)(&local_5e0);
                        auVar191 = ZEXT1664(_local_3e0);
                        auVar183 = ZEXT3264(local_520);
                        auVar194 = ZEXT3264(local_540);
                        auVar195 = ZEXT3264(local_460);
                        auVar196 = ZEXT3264(local_440);
                        auVar180 = ZEXT1664(local_660);
                        in_ZMM21 = ZEXT3264(local_4a0);
                        in_ZMM20 = ZEXT3264(local_480);
                        auVar94 = vxorps_avx512vl(auVar94,auVar94);
                        auVar198 = ZEXT1664(auVar94);
                        context = local_670;
                        ray = local_678;
                        pre = local_648;
                        pPVar86 = local_650;
                        fVar157 = local_4e0;
                      }
                      fVar149 = auVar191._0_4_;
                      auVar104 = auVar183._0_32_;
                      if (*local_5e0.valid == 0) goto LAB_01d504d4;
                    }
                    uVar80 = (ulong)(uint)local_580._0_4_;
                    break;
                  }
                  (*pGVar11->occlusionFilterN)(&local_5e0);
                  auVar191 = ZEXT1664(_local_3e0);
                  auVar183 = ZEXT3264(local_520);
                  auVar194 = ZEXT3264(local_540);
                  auVar195 = ZEXT3264(local_460);
                  auVar196 = ZEXT3264(local_440);
                  auVar180 = ZEXT1664(local_660);
                  in_ZMM21 = ZEXT3264(local_4a0);
                  in_ZMM20 = ZEXT3264(local_480);
                  auVar94 = vxorps_avx512vl(auVar197,auVar197);
                  auVar198 = ZEXT1664(auVar94);
                  context = local_670;
                  ray = local_678;
                  pre = local_648;
                  pPVar86 = local_650;
                  fVar157 = local_4e0;
                  if (*local_5e0.valid != 0) goto LAB_01d5041f;
LAB_01d504d4:
                  auVar104 = auVar183._0_32_;
                  ray->tfar = (float)local_680;
                  uVar84 = local_4c0._0_8_ ^ 1L << ((ulong)local_2a0 & 0x3f);
                  local_4c0._0_8_ = uVar84;
                  lVar89 = 0;
                  for (uVar80 = uVar84; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000
                      ) {
                    lVar89 = lVar89 + 1;
                  }
                  uVar80 = CONCAT71((int7)(uVar84 >> 8),uVar84 != 0);
                  fVar149 = auVar191._0_4_;
                } while (uVar84 != 0);
                local_4e0 = fVar149;
                pRVar83 = (RTCIntersectArguments *)(uVar80 & 0xffffffffffffff01);
                auVar178 = ZEXT3264(local_600);
                auVar155 = ZEXT3264(local_620);
              }
              goto LAB_01d50559;
            }
          }
        }
        pRVar83 = (RTCIntersectArguments *)0x0;
      }
LAB_01d50559:
      local_670 = context;
      local_678 = ray;
      local_650 = pPVar86;
      if (8 < iVar10) {
        _local_4c0 = vpbroadcastd_avx512vl();
        local_2a0 = (uint)fVar157;
        uStack_29c = fVar157;
        uStack_298 = fVar157;
        uStack_294 = fVar157;
        uStack_290 = fVar157;
        uStack_28c = fVar157;
        uStack_288 = fVar157;
        uStack_284 = fVar157;
        fStack_3d0 = 1.0 / (float)local_640._0_4_;
        local_3e0._4_4_ = fStack_3d0;
        local_3e0._0_4_ = fStack_3d0;
        fStack_3d8 = fStack_3d0;
        fStack_3d4 = fStack_3d0;
        lVar89 = 8;
        local_600 = auVar178._0_32_;
        local_620 = auVar155._0_32_;
        pRVar85 = pRVar83;
        local_520 = auVar104;
        fStack_4dc = local_4e0;
        fStack_4d8 = local_4e0;
        fStack_4d4 = local_4e0;
        fStack_4d0 = local_4e0;
        fStack_4cc = local_4e0;
        fStack_4c8 = local_4e0;
        fStack_4c4 = local_4e0;
        fStack_3cc = fStack_3d0;
        fStack_3c8 = fStack_3d0;
        fStack_3c4 = fStack_3d0;
        do {
          local_580._0_4_ = (int)pRVar85;
          auVar106 = vpbroadcastd_avx512vl();
          auVar114 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar21 = vpcmpd_avx512vl(auVar114,_local_4c0,1);
          auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar89 * 4 + lVar22);
          auVar105 = *(undefined1 (*) [32])(lVar22 + 0x222bfac + lVar89 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar22 + 0x222c430 + lVar89 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar22 + 0x222c8b4 + lVar89 * 4);
          auVar113 = vmulps_avx512vl(local_e0,auVar116);
          auVar107 = vmulps_avx512vl(local_100,auVar116);
          auVar53._4_4_ = auVar116._4_4_ * (float)local_180._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * (float)local_180._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * fStack_178;
          auVar53._12_4_ = auVar116._12_4_ * fStack_174;
          auVar53._16_4_ = auVar116._16_4_ * fStack_170;
          auVar53._20_4_ = auVar116._20_4_ * fStack_16c;
          auVar53._24_4_ = auVar116._24_4_ * fStack_168;
          auVar53._28_4_ = auVar114._28_4_;
          auVar114 = vfmadd231ps_avx512vl(auVar113,auVar115,local_a0);
          auVar113 = vfmadd231ps_avx512vl(auVar107,auVar115,local_c0);
          auVar107 = vfmadd231ps_avx512vl(auVar53,auVar115,local_160);
          auVar111 = auVar194._0_32_;
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,auVar111);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,local_200);
          auVar94 = vfmadd231ps_fma(auVar107,auVar105,local_140);
          auVar177 = auVar196._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar114,auVar106,auVar177);
          auVar176 = auVar195._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar113,auVar106,auVar176);
          auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar89 * 4 + lVar22);
          auVar113 = *(undefined1 (*) [32])(lVar22 + 0x222e3cc + lVar89 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_120);
          auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222e850 + lVar89 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar22 + 0x222ecd4 + lVar89 * 4);
          auVar112 = vmulps_avx512vl(local_e0,auVar108);
          auVar103 = vmulps_avx512vl(local_100,auVar108);
          auVar54._4_4_ = auVar108._4_4_ * (float)local_180._4_4_;
          auVar54._0_4_ = auVar108._0_4_ * (float)local_180._0_4_;
          auVar54._8_4_ = auVar108._8_4_ * fStack_178;
          auVar54._12_4_ = auVar108._12_4_ * fStack_174;
          auVar54._16_4_ = auVar108._16_4_ * fStack_170;
          auVar54._20_4_ = auVar108._20_4_ * fStack_16c;
          auVar54._24_4_ = auVar108._24_4_ * fStack_168;
          auVar54._28_4_ = uStack_164;
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_a0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar54,auVar107,local_160);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar113,auVar111);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_200);
          auVar92 = vfmadd231ps_fma(auVar100,auVar113,local_140);
          auVar100 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar177);
          auVar101 = vfmadd231ps_avx512vl(auVar103,auVar114,auVar176);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar114,local_120);
          auVar102 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar92));
          auVar112 = vsubps_avx(auVar100,auVar104);
          auVar103 = vsubps_avx(auVar101,auVar99);
          auVar109 = vmulps_avx512vl(auVar99,auVar112);
          auVar110 = vmulps_avx512vl(auVar104,auVar103);
          auVar109 = vsubps_avx512vl(auVar109,auVar110);
          auVar110 = vmulps_avx512vl(auVar103,auVar103);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar112);
          auVar102 = vmulps_avx512vl(auVar102,auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar110);
          auVar109 = vmulps_avx512vl(auVar109,auVar109);
          uVar81 = vcmpps_avx512vl(auVar109,auVar102,2);
          local_310 = (byte)uVar21 & (byte)uVar81;
          if (local_310 == 0) {
            auVar194 = ZEXT3264(auVar111);
LAB_01d5102d:
            auVar178 = ZEXT3264(local_600);
            auVar155 = ZEXT3264(local_620);
            auVar191 = ZEXT3264(auVar176);
            pRVar83 = (RTCIntersectArguments *)((ulong)pRVar85 & 0xffffffff);
          }
          else {
            auVar108 = vmulps_avx512vl(local_520,auVar108);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_1e0,auVar108);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_1c0,auVar107);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
            auVar116 = vmulps_avx512vl(local_520,auVar116);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_1e0,auVar116);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_1c0,auVar115);
            auVar113 = vfmadd213ps_avx512vl(auVar106,local_1a0,auVar105);
            auVar106 = *(undefined1 (*) [32])(lVar22 + 0x222cd38 + lVar89 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar22 + 0x222d1bc + lVar89 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar22 + 0x222d640 + lVar89 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar22 + 0x222dac4 + lVar89 * 4);
            auVar107 = vmulps_avx512vl(local_e0,auVar116);
            auVar108 = vmulps_avx512vl(local_100,auVar116);
            auVar116 = vmulps_avx512vl(local_520,auVar116);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_a0);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,local_c0);
            auVar115 = vfmadd231ps_avx512vl(auVar116,local_1e0,auVar115);
            auVar116 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar111);
            auVar107 = vfmadd231ps_avx512vl(auVar108,auVar105,local_200);
            auVar105 = vfmadd231ps_avx512vl(auVar115,local_1c0,auVar105);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar106,auVar177);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar176);
            auVar108 = vfmadd231ps_avx512vl(auVar105,local_1a0,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar22 + 0x222f158 + lVar89 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar22 + 0x222fa60 + lVar89 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar22 + 0x222fee4 + lVar89 * 4);
            auVar102 = vmulps_avx512vl(local_e0,auVar115);
            auVar109 = vmulps_avx512vl(local_100,auVar115);
            auVar115 = vmulps_avx512vl(local_520,auVar115);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_a0);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_c0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_1e0,auVar105);
            auVar105 = *(undefined1 (*) [32])(lVar22 + 0x222f5dc + lVar89 * 4);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar111);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_200);
            auVar105 = vfmadd231ps_avx512vl(auVar115,local_1c0,auVar105);
            auVar115 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar177);
            auVar102 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar176);
            auVar105 = vfmadd231ps_avx512vl(auVar105,local_1a0,auVar106);
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar116,auVar109);
            vandps_avx512vl(auVar107,auVar109);
            auVar106 = vmaxps_avx(auVar109,auVar109);
            vandps_avx512vl(auVar108,auVar109);
            auVar106 = vmaxps_avx(auVar106,auVar109);
            auVar75._4_4_ = fStack_4dc;
            auVar75._0_4_ = local_4e0;
            auVar75._8_4_ = fStack_4d8;
            auVar75._12_4_ = fStack_4d4;
            auVar75._16_4_ = fStack_4d0;
            auVar75._20_4_ = fStack_4cc;
            auVar75._24_4_ = fStack_4c8;
            auVar75._28_4_ = fStack_4c4;
            uVar80 = vcmpps_avx512vl(auVar106,auVar75,1);
            bVar14 = (bool)((byte)uVar80 & 1);
            auVar127._0_4_ = (float)((uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar116._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar116._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar116._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar116._12_4_);
            bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar14 * auVar112._16_4_ | (uint)!bVar14 * auVar116._16_4_);
            bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar14 * auVar112._20_4_ | (uint)!bVar14 * auVar116._20_4_);
            bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar14 * auVar112._24_4_ | (uint)!bVar14 * auVar116._24_4_);
            bVar14 = SUB81(uVar80 >> 7,0);
            auVar127._28_4_ = (uint)bVar14 * auVar112._28_4_ | (uint)!bVar14 * auVar116._28_4_;
            bVar14 = (bool)((byte)uVar80 & 1);
            auVar128._0_4_ = (float)((uint)bVar14 * auVar103._0_4_ | (uint)!bVar14 * auVar107._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar107._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar107._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar107._12_4_);
            bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar14 * auVar103._16_4_ | (uint)!bVar14 * auVar107._16_4_);
            bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar14 * auVar103._20_4_ | (uint)!bVar14 * auVar107._20_4_);
            bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar14 * auVar103._24_4_ | (uint)!bVar14 * auVar107._24_4_);
            bVar14 = SUB81(uVar80 >> 7,0);
            auVar128._28_4_ = (uint)bVar14 * auVar103._28_4_ | (uint)!bVar14 * auVar107._28_4_;
            vandps_avx512vl(auVar115,auVar109);
            vandps_avx512vl(auVar102,auVar109);
            auVar106 = vmaxps_avx(auVar128,auVar128);
            vandps_avx512vl(auVar105,auVar109);
            auVar106 = vmaxps_avx(auVar106,auVar128);
            uVar80 = vcmpps_avx512vl(auVar106,auVar75,1);
            bVar14 = (bool)((byte)uVar80 & 1);
            auVar129._0_4_ = (uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar115._0_4_;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar115._4_4_;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar115._8_4_;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar115._12_4_;
            bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar129._16_4_ = (uint)bVar14 * auVar112._16_4_ | (uint)!bVar14 * auVar115._16_4_;
            bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar129._20_4_ = (uint)bVar14 * auVar112._20_4_ | (uint)!bVar14 * auVar115._20_4_;
            bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar129._24_4_ = (uint)bVar14 * auVar112._24_4_ | (uint)!bVar14 * auVar115._24_4_;
            bVar14 = SUB81(uVar80 >> 7,0);
            auVar129._28_4_ = (uint)bVar14 * auVar112._28_4_ | (uint)!bVar14 * auVar115._28_4_;
            bVar14 = (bool)((byte)uVar80 & 1);
            auVar130._0_4_ = (float)((uint)bVar14 * auVar103._0_4_ | (uint)!bVar14 * auVar102._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar102._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar102._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar102._12_4_);
            bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar14 * auVar103._16_4_ | (uint)!bVar14 * auVar102._16_4_);
            bVar14 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar14 * auVar103._20_4_ | (uint)!bVar14 * auVar102._20_4_);
            bVar14 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar14 * auVar103._24_4_ | (uint)!bVar14 * auVar102._24_4_);
            bVar14 = SUB81(uVar80 >> 7,0);
            auVar130._28_4_ = (uint)bVar14 * auVar103._28_4_ | (uint)!bVar14 * auVar102._28_4_;
            auVar185._8_4_ = 0x80000000;
            auVar185._0_8_ = 0x8000000080000000;
            auVar185._12_4_ = 0x80000000;
            auVar185._16_4_ = 0x80000000;
            auVar185._20_4_ = 0x80000000;
            auVar185._24_4_ = 0x80000000;
            auVar185._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar129,auVar185);
            auVar102 = auVar198._0_32_;
            auVar105 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar102);
            auVar98 = vfmadd231ps_fma(auVar105,auVar128,auVar128);
            auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
            auVar193._8_4_ = 0xbf000000;
            auVar193._0_8_ = 0xbf000000bf000000;
            auVar193._12_4_ = 0xbf000000;
            auVar193._16_4_ = 0xbf000000;
            auVar193._20_4_ = 0xbf000000;
            auVar193._24_4_ = 0xbf000000;
            auVar193._28_4_ = 0xbf000000;
            fVar157 = auVar105._0_4_;
            fVar149 = auVar105._4_4_;
            fVar162 = auVar105._8_4_;
            fVar171 = auVar105._12_4_;
            fVar172 = auVar105._16_4_;
            fVar173 = auVar105._20_4_;
            fVar161 = auVar105._24_4_;
            auVar55._4_4_ = fVar149 * fVar149 * fVar149 * auVar98._4_4_ * -0.5;
            auVar55._0_4_ = fVar157 * fVar157 * fVar157 * auVar98._0_4_ * -0.5;
            auVar55._8_4_ = fVar162 * fVar162 * fVar162 * auVar98._8_4_ * -0.5;
            auVar55._12_4_ = fVar171 * fVar171 * fVar171 * auVar98._12_4_ * -0.5;
            auVar55._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar55._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar55._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar55._28_4_ = auVar128._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar105 = vfmadd231ps_avx512vl(auVar55,auVar115,auVar105);
            auVar56._4_4_ = auVar128._4_4_ * auVar105._4_4_;
            auVar56._0_4_ = auVar128._0_4_ * auVar105._0_4_;
            auVar56._8_4_ = auVar128._8_4_ * auVar105._8_4_;
            auVar56._12_4_ = auVar128._12_4_ * auVar105._12_4_;
            auVar56._16_4_ = auVar128._16_4_ * auVar105._16_4_;
            auVar56._20_4_ = auVar128._20_4_ * auVar105._20_4_;
            auVar56._24_4_ = auVar128._24_4_ * auVar105._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar105._4_4_ * -auVar127._4_4_;
            auVar57._0_4_ = auVar105._0_4_ * -auVar127._0_4_;
            auVar57._8_4_ = auVar105._8_4_ * -auVar127._8_4_;
            auVar57._12_4_ = auVar105._12_4_ * -auVar127._12_4_;
            auVar57._16_4_ = auVar105._16_4_ * -auVar127._16_4_;
            auVar57._20_4_ = auVar105._20_4_ * -auVar127._20_4_;
            auVar57._24_4_ = auVar105._24_4_ * -auVar127._24_4_;
            auVar57._28_4_ = auVar128._28_4_;
            auVar116 = vmulps_avx512vl(auVar105,auVar102);
            auVar105 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar102);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar130,auVar130);
            auVar107 = vrsqrt14ps_avx512vl(auVar105);
            auVar105 = vmulps_avx512vl(auVar105,auVar193);
            fVar157 = auVar107._0_4_;
            fVar149 = auVar107._4_4_;
            fVar162 = auVar107._8_4_;
            fVar171 = auVar107._12_4_;
            fVar172 = auVar107._16_4_;
            fVar173 = auVar107._20_4_;
            fVar161 = auVar107._24_4_;
            auVar58._4_4_ = fVar149 * fVar149 * fVar149 * auVar105._4_4_;
            auVar58._0_4_ = fVar157 * fVar157 * fVar157 * auVar105._0_4_;
            auVar58._8_4_ = fVar162 * fVar162 * fVar162 * auVar105._8_4_;
            auVar58._12_4_ = fVar171 * fVar171 * fVar171 * auVar105._12_4_;
            auVar58._16_4_ = fVar172 * fVar172 * fVar172 * auVar105._16_4_;
            auVar58._20_4_ = fVar173 * fVar173 * fVar173 * auVar105._20_4_;
            auVar58._24_4_ = fVar161 * fVar161 * fVar161 * auVar105._24_4_;
            auVar58._28_4_ = auVar105._28_4_;
            auVar105 = vfmadd231ps_avx512vl(auVar58,auVar115,auVar107);
            auVar59._4_4_ = auVar130._4_4_ * auVar105._4_4_;
            auVar59._0_4_ = auVar130._0_4_ * auVar105._0_4_;
            auVar59._8_4_ = auVar130._8_4_ * auVar105._8_4_;
            auVar59._12_4_ = auVar130._12_4_ * auVar105._12_4_;
            auVar59._16_4_ = auVar130._16_4_ * auVar105._16_4_;
            auVar59._20_4_ = auVar130._20_4_ * auVar105._20_4_;
            auVar59._24_4_ = auVar130._24_4_ * auVar105._24_4_;
            auVar59._28_4_ = auVar107._28_4_;
            auVar60._4_4_ = auVar105._4_4_ * auVar106._4_4_;
            auVar60._0_4_ = auVar105._0_4_ * auVar106._0_4_;
            auVar60._8_4_ = auVar105._8_4_ * auVar106._8_4_;
            auVar60._12_4_ = auVar105._12_4_ * auVar106._12_4_;
            auVar60._16_4_ = auVar105._16_4_ * auVar106._16_4_;
            auVar60._20_4_ = auVar105._20_4_ * auVar106._20_4_;
            auVar60._24_4_ = auVar105._24_4_ * auVar106._24_4_;
            auVar60._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar105,auVar102);
            auVar98 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar94),auVar104);
            auVar105 = ZEXT1632(auVar94);
            auVar197 = vfmadd213ps_fma(auVar57,auVar105,auVar99);
            auVar115 = vfmadd213ps_avx512vl(auVar116,auVar105,auVar113);
            auVar107 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar92),auVar100);
            auVar95 = vfnmadd213ps_fma(auVar56,auVar105,auVar104);
            auVar108 = ZEXT1632(auVar92);
            auVar6 = vfmadd213ps_fma(auVar60,auVar108,auVar101);
            auVar96 = vfnmadd213ps_fma(auVar57,auVar105,auVar99);
            auVar7 = vfmadd213ps_fma(auVar106,auVar108,auVar114);
            auVar99 = ZEXT1632(auVar94);
            auVar97 = vfnmadd231ps_fma(auVar113,auVar99,auVar116);
            auVar150 = vfnmadd213ps_fma(auVar59,auVar108,auVar100);
            auVar158 = vfnmadd213ps_fma(auVar60,auVar108,auVar101);
            auVar181 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar92),auVar106);
            auVar114 = vsubps_avx512vl(auVar107,ZEXT1632(auVar95));
            auVar106 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar96));
            auVar105 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar97));
            auVar61._4_4_ = auVar106._4_4_ * auVar97._4_4_;
            auVar61._0_4_ = auVar106._0_4_ * auVar97._0_4_;
            auVar61._8_4_ = auVar106._8_4_ * auVar97._8_4_;
            auVar61._12_4_ = auVar106._12_4_ * auVar97._12_4_;
            auVar61._16_4_ = auVar106._16_4_ * 0.0;
            auVar61._20_4_ = auVar106._20_4_ * 0.0;
            auVar61._24_4_ = auVar106._24_4_ * 0.0;
            auVar61._28_4_ = auVar116._28_4_;
            auVar94 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar96),auVar105);
            auVar62._4_4_ = auVar105._4_4_ * auVar95._4_4_;
            auVar62._0_4_ = auVar105._0_4_ * auVar95._0_4_;
            auVar62._8_4_ = auVar105._8_4_ * auVar95._8_4_;
            auVar62._12_4_ = auVar105._12_4_ * auVar95._12_4_;
            auVar62._16_4_ = auVar105._16_4_ * 0.0;
            auVar62._20_4_ = auVar105._20_4_ * 0.0;
            auVar62._24_4_ = auVar105._24_4_ * 0.0;
            auVar62._28_4_ = auVar105._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar97),auVar114);
            auVar63._4_4_ = auVar96._4_4_ * auVar114._4_4_;
            auVar63._0_4_ = auVar96._0_4_ * auVar114._0_4_;
            auVar63._8_4_ = auVar96._8_4_ * auVar114._8_4_;
            auVar63._12_4_ = auVar96._12_4_ * auVar114._12_4_;
            auVar63._16_4_ = auVar114._16_4_ * 0.0;
            auVar63._20_4_ = auVar114._20_4_ * 0.0;
            auVar63._24_4_ = auVar114._24_4_ * 0.0;
            auVar63._28_4_ = auVar114._28_4_;
            auVar93 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar95),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar102,ZEXT1632(auVar8));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar94));
            uVar80 = vcmpps_avx512vl(auVar106,auVar102,2);
            bVar13 = (byte)uVar80;
            fVar136 = (float)((uint)(bVar13 & 1) * auVar98._0_4_ |
                             (uint)!(bool)(bVar13 & 1) * auVar150._0_4_);
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            fVar138 = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar150._4_4_);
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            fVar140 = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar150._8_4_);
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            fVar142 = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar150._12_4_);
            auVar108 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar136))));
            fVar137 = (float)((uint)(bVar13 & 1) * auVar197._0_4_ |
                             (uint)!(bool)(bVar13 & 1) * auVar158._0_4_);
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            fVar139 = (float)((uint)bVar14 * auVar197._4_4_ | (uint)!bVar14 * auVar158._4_4_);
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            fVar141 = (float)((uint)bVar14 * auVar197._8_4_ | (uint)!bVar14 * auVar158._8_4_);
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            fVar143 = (float)((uint)bVar14 * auVar197._12_4_ | (uint)!bVar14 * auVar158._12_4_);
            auVar112 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar137))));
            auVar131._0_4_ =
                 (float)((uint)(bVar13 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar181._0_4_);
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * auVar181._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * auVar181._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * auVar181._12_4_);
            fVar157 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar115._16_4_);
            auVar131._16_4_ = fVar157;
            fVar162 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar115._20_4_);
            auVar131._20_4_ = fVar162;
            fVar149 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar115._24_4_);
            auVar131._24_4_ = fVar149;
            iVar1 = (uint)(byte)(uVar80 >> 7) * auVar115._28_4_;
            auVar131._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar95),auVar107);
            auVar132._0_4_ =
                 (uint)(bVar13 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar94._0_4_;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar94._4_4_;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar94._8_4_;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar94._12_4_;
            auVar132._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar106._16_4_;
            auVar132._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar106._20_4_;
            auVar132._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar106._24_4_;
            auVar132._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar6));
            auVar133._0_4_ =
                 (float)((uint)(bVar13 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar98._0_4_);
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar98._4_4_);
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar98._8_4_);
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar98._12_4_);
            fVar171 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar106._16_4_);
            auVar133._16_4_ = fVar171;
            fVar173 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar106._20_4_);
            auVar133._20_4_ = fVar173;
            fVar172 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar106._24_4_);
            auVar133._24_4_ = fVar172;
            auVar133._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar7));
            auVar134._0_4_ =
                 (float)((uint)(bVar13 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar13 & 1) * auVar197._0_4_);
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar197._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar197._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar197._12_4_);
            fVar156 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar106._16_4_);
            auVar134._16_4_ = fVar156;
            fVar91 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar106._20_4_);
            auVar134._20_4_ = fVar91;
            fVar161 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar106._24_4_);
            auVar134._24_4_ = fVar161;
            iVar2 = (uint)(byte)(uVar80 >> 7) * auVar106._28_4_;
            auVar134._28_4_ = iVar2;
            auVar135._0_4_ =
                 (uint)(bVar13 & 1) * (int)auVar95._0_4_ |
                 (uint)!(bool)(bVar13 & 1) * auVar107._0_4_;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar14 * (int)auVar95._4_4_ | (uint)!bVar14 * auVar107._4_4_;
            bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar14 * (int)auVar95._8_4_ | (uint)!bVar14 * auVar107._8_4_;
            bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar14 * (int)auVar95._12_4_ | (uint)!bVar14 * auVar107._12_4_;
            auVar135._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar107._16_4_;
            auVar135._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar107._20_4_;
            auVar135._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar107._24_4_;
            auVar135._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar107._28_4_;
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar135,auVar108);
            auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar96._12_4_ |
                                                     (uint)!bVar18 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar96._8_4_ |
                                                              (uint)!bVar16 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar96._4_4_ |
                                                                       (uint)!bVar14 * auVar6._4_4_,
                                                                       (uint)(bVar13 & 1) *
                                                                       (int)auVar96._0_4_ |
                                                                       (uint)!(bool)(bVar13 & 1) *
                                                                       auVar6._0_4_)))),auVar112);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar97._12_4_ |
                                                     (uint)!bVar19 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar97._8_4_ |
                                                              (uint)!bVar17 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar15 * auVar7._4_4_,
                                                                       (uint)(bVar13 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar13 & 1) *
                                                                       auVar7._0_4_)))),auVar131);
            auVar116 = vsubps_avx(auVar108,auVar132);
            auVar114 = vsubps_avx(auVar112,auVar133);
            auVar113 = vsubps_avx(auVar131,auVar134);
            auVar64._4_4_ = auVar115._4_4_ * fVar138;
            auVar64._0_4_ = auVar115._0_4_ * fVar136;
            auVar64._8_4_ = auVar115._8_4_ * fVar140;
            auVar64._12_4_ = auVar115._12_4_ * fVar142;
            auVar64._16_4_ = auVar115._16_4_ * 0.0;
            auVar64._20_4_ = auVar115._20_4_ * 0.0;
            auVar64._24_4_ = auVar115._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar64,auVar131,auVar107);
            auVar160._0_4_ = fVar137 * auVar107._0_4_;
            auVar160._4_4_ = fVar139 * auVar107._4_4_;
            auVar160._8_4_ = fVar141 * auVar107._8_4_;
            auVar160._12_4_ = fVar143 * auVar107._12_4_;
            auVar160._16_4_ = auVar107._16_4_ * 0.0;
            auVar160._20_4_ = auVar107._20_4_ * 0.0;
            auVar160._24_4_ = auVar107._24_4_ * 0.0;
            auVar160._28_4_ = 0;
            auVar98 = vfmsub231ps_fma(auVar160,auVar108,auVar105);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar102,ZEXT1632(auVar94));
            auVar169._0_4_ = auVar105._0_4_ * auVar131._0_4_;
            auVar169._4_4_ = auVar105._4_4_ * auVar131._4_4_;
            auVar169._8_4_ = auVar105._8_4_ * auVar131._8_4_;
            auVar169._12_4_ = auVar105._12_4_ * auVar131._12_4_;
            auVar169._16_4_ = auVar105._16_4_ * fVar157;
            auVar169._20_4_ = auVar105._20_4_ * fVar162;
            auVar169._24_4_ = auVar105._24_4_ * fVar149;
            auVar169._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar169,auVar112,auVar115);
            auVar103 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar94));
            auVar106 = vmulps_avx512vl(auVar113,auVar132);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar134);
            auVar65._4_4_ = auVar114._4_4_ * auVar134._4_4_;
            auVar65._0_4_ = auVar114._0_4_ * auVar134._0_4_;
            auVar65._8_4_ = auVar114._8_4_ * auVar134._8_4_;
            auVar65._12_4_ = auVar114._12_4_ * auVar134._12_4_;
            auVar65._16_4_ = auVar114._16_4_ * fVar156;
            auVar65._20_4_ = auVar114._20_4_ * fVar91;
            auVar65._24_4_ = auVar114._24_4_ * fVar161;
            auVar65._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar65,auVar133,auVar113);
            auVar170._0_4_ = auVar133._0_4_ * auVar116._0_4_;
            auVar170._4_4_ = auVar133._4_4_ * auVar116._4_4_;
            auVar170._8_4_ = auVar133._8_4_ * auVar116._8_4_;
            auVar170._12_4_ = auVar133._12_4_ * auVar116._12_4_;
            auVar170._16_4_ = fVar171 * auVar116._16_4_;
            auVar170._20_4_ = fVar173 * auVar116._20_4_;
            auVar170._24_4_ = fVar172 * auVar116._24_4_;
            auVar170._28_4_ = 0;
            auVar98 = vfmsub231ps_fma(auVar170,auVar114,auVar132);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar102,auVar106);
            auVar104 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar94));
            auVar106 = vmaxps_avx(auVar103,auVar104);
            uVar81 = vcmpps_avx512vl(auVar106,auVar102,2);
            local_310 = local_310 & (byte)uVar81;
            auVar191 = ZEXT3264(auVar176);
            if (local_310 == 0) {
              local_310 = 0;
            }
            else {
              auVar66._4_4_ = auVar113._4_4_ * auVar105._4_4_;
              auVar66._0_4_ = auVar113._0_4_ * auVar105._0_4_;
              auVar66._8_4_ = auVar113._8_4_ * auVar105._8_4_;
              auVar66._12_4_ = auVar113._12_4_ * auVar105._12_4_;
              auVar66._16_4_ = auVar113._16_4_ * auVar105._16_4_;
              auVar66._20_4_ = auVar113._20_4_ * auVar105._20_4_;
              auVar66._24_4_ = auVar113._24_4_ * auVar105._24_4_;
              auVar66._28_4_ = auVar106._28_4_;
              auVar197 = vfmsub231ps_fma(auVar66,auVar114,auVar115);
              auVar67._4_4_ = auVar115._4_4_ * auVar116._4_4_;
              auVar67._0_4_ = auVar115._0_4_ * auVar116._0_4_;
              auVar67._8_4_ = auVar115._8_4_ * auVar116._8_4_;
              auVar67._12_4_ = auVar115._12_4_ * auVar116._12_4_;
              auVar67._16_4_ = auVar115._16_4_ * auVar116._16_4_;
              auVar67._20_4_ = auVar115._20_4_ * auVar116._20_4_;
              auVar67._24_4_ = auVar115._24_4_ * auVar116._24_4_;
              auVar67._28_4_ = auVar115._28_4_;
              auVar98 = vfmsub231ps_fma(auVar67,auVar107,auVar113);
              auVar68._4_4_ = auVar114._4_4_ * auVar107._4_4_;
              auVar68._0_4_ = auVar114._0_4_ * auVar107._0_4_;
              auVar68._8_4_ = auVar114._8_4_ * auVar107._8_4_;
              auVar68._12_4_ = auVar114._12_4_ * auVar107._12_4_;
              auVar68._16_4_ = auVar114._16_4_ * auVar107._16_4_;
              auVar68._20_4_ = auVar114._20_4_ * auVar107._20_4_;
              auVar68._24_4_ = auVar114._24_4_ * auVar107._24_4_;
              auVar68._28_4_ = auVar114._28_4_;
              auVar6 = vfmsub231ps_fma(auVar68,auVar116,auVar105);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar98),ZEXT1632(auVar6));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar197),auVar102);
              auVar105 = vrcp14ps_avx512vl(auVar106);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = &DAT_3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar105,auVar106,auVar30);
              auVar94 = vfmadd132ps_fma(auVar115,auVar105,auVar105);
              auVar69._4_4_ = auVar6._4_4_ * auVar131._4_4_;
              auVar69._0_4_ = auVar6._0_4_ * auVar131._0_4_;
              auVar69._8_4_ = auVar6._8_4_ * auVar131._8_4_;
              auVar69._12_4_ = auVar6._12_4_ * auVar131._12_4_;
              auVar69._16_4_ = fVar157 * 0.0;
              auVar69._20_4_ = fVar162 * 0.0;
              auVar69._24_4_ = fVar149 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar98 = vfmadd231ps_fma(auVar69,auVar112,ZEXT1632(auVar98));
              auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar108,ZEXT1632(auVar197));
              fVar149 = auVar94._0_4_;
              fVar162 = auVar94._4_4_;
              fVar171 = auVar94._8_4_;
              fVar172 = auVar94._12_4_;
              auVar105 = ZEXT1632(CONCAT412(auVar98._12_4_ * fVar172,
                                            CONCAT48(auVar98._8_4_ * fVar171,
                                                     CONCAT44(auVar98._4_4_ * fVar162,
                                                              auVar98._0_4_ * fVar149))));
              auVar76._4_4_ = uStack_29c;
              auVar76._0_4_ = local_2a0;
              auVar76._8_4_ = uStack_298;
              auVar76._12_4_ = uStack_294;
              auVar76._16_4_ = uStack_290;
              auVar76._20_4_ = uStack_28c;
              auVar76._24_4_ = uStack_288;
              auVar76._28_4_ = uStack_284;
              uVar81 = vcmpps_avx512vl(auVar105,auVar76,0xd);
              fVar157 = local_678->tfar;
              auVar31._4_4_ = fVar157;
              auVar31._0_4_ = fVar157;
              auVar31._8_4_ = fVar157;
              auVar31._12_4_ = fVar157;
              auVar31._16_4_ = fVar157;
              auVar31._20_4_ = fVar157;
              auVar31._24_4_ = fVar157;
              auVar31._28_4_ = fVar157;
              uVar21 = vcmpps_avx512vl(auVar105,auVar31,2);
              local_310 = (byte)uVar81 & (byte)uVar21 & local_310;
              if (local_310 == 0) {
                local_310 = 0;
              }
              else {
                uVar81 = vcmpps_avx512vl(auVar106,auVar102,4);
                if ((local_310 & (byte)uVar81) == 0) {
                  local_310 = 0;
                }
                else {
                  local_310 = local_310 & (byte)uVar81;
                  fVar157 = auVar103._0_4_ * fVar149;
                  fVar173 = auVar103._4_4_ * fVar162;
                  auVar70._4_4_ = fVar173;
                  auVar70._0_4_ = fVar157;
                  fVar161 = auVar103._8_4_ * fVar171;
                  auVar70._8_4_ = fVar161;
                  fVar91 = auVar103._12_4_ * fVar172;
                  auVar70._12_4_ = fVar91;
                  fVar156 = auVar103._16_4_ * 0.0;
                  auVar70._16_4_ = fVar156;
                  fVar136 = auVar103._20_4_ * 0.0;
                  auVar70._20_4_ = fVar136;
                  fVar137 = auVar103._24_4_ * 0.0;
                  auVar70._24_4_ = fVar137;
                  auVar70._28_4_ = auVar103._28_4_;
                  fVar149 = auVar104._0_4_ * fVar149;
                  fVar162 = auVar104._4_4_ * fVar162;
                  auVar71._4_4_ = fVar162;
                  auVar71._0_4_ = fVar149;
                  fVar171 = auVar104._8_4_ * fVar171;
                  auVar71._8_4_ = fVar171;
                  fVar172 = auVar104._12_4_ * fVar172;
                  auVar71._12_4_ = fVar172;
                  fVar138 = auVar104._16_4_ * 0.0;
                  auVar71._16_4_ = fVar138;
                  fVar139 = auVar104._20_4_ * 0.0;
                  auVar71._20_4_ = fVar139;
                  fVar140 = auVar104._24_4_ * 0.0;
                  auVar71._24_4_ = fVar140;
                  auVar71._28_4_ = auVar104._28_4_;
                  auVar175._8_4_ = 0x3f800000;
                  auVar175._0_8_ = &DAT_3f8000003f800000;
                  auVar175._12_4_ = 0x3f800000;
                  auVar175._16_4_ = 0x3f800000;
                  auVar175._20_4_ = 0x3f800000;
                  auVar175._24_4_ = 0x3f800000;
                  auVar175._28_4_ = 0x3f800000;
                  auVar106 = vsubps_avx512vl(auVar175,auVar70);
                  bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
                  bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
                  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                  bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
                  bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                  bVar19 = (bool)((byte)(uVar80 >> 6) & 1);
                  bVar20 = SUB81(uVar80 >> 7,0);
                  in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar20 * auVar103._28_4_ |
                                                (uint)!bVar20 * auVar106._28_4_,
                                                CONCAT424((uint)bVar19 * (int)fVar137 |
                                                          (uint)!bVar19 * auVar106._24_4_,
                                                          CONCAT420((uint)bVar18 * (int)fVar136 |
                                                                    (uint)!bVar18 * auVar106._20_4_,
                                                                    CONCAT416((uint)bVar17 *
                                                                              (int)fVar156 |
                                                                              (uint)!bVar17 *
                                                                              auVar106._16_4_,
                                                                              CONCAT412((uint)bVar16
                                                                                        * (int)
                                                  fVar91 | (uint)!bVar16 * auVar106._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)fVar161 |
                                                           (uint)!bVar15 * auVar106._8_4_,
                                                           CONCAT44((uint)bVar14 * (int)fVar173 |
                                                                    (uint)!bVar14 * auVar106._4_4_,
                                                                    (uint)(bVar13 & 1) *
                                                                    (int)fVar157 |
                                                                    (uint)!(bool)(bVar13 & 1) *
                                                                    auVar106._0_4_))))))));
                  auVar106 = vsubps_avx(auVar175,auVar71);
                  bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
                  bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
                  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                  bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
                  bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                  bVar19 = (bool)((byte)(uVar80 >> 6) & 1);
                  bVar20 = SUB81(uVar80 >> 7,0);
                  local_280._4_4_ = (uint)bVar14 * (int)fVar162 | (uint)!bVar14 * auVar106._4_4_;
                  local_280._0_4_ =
                       (uint)(bVar13 & 1) * (int)fVar149 |
                       (uint)!(bool)(bVar13 & 1) * auVar106._0_4_;
                  local_280._8_4_ = (uint)bVar15 * (int)fVar171 | (uint)!bVar15 * auVar106._8_4_;
                  local_280._12_4_ = (uint)bVar16 * (int)fVar172 | (uint)!bVar16 * auVar106._12_4_;
                  local_280._16_4_ = (uint)bVar17 * (int)fVar138 | (uint)!bVar17 * auVar106._16_4_;
                  local_280._20_4_ = (uint)bVar18 * (int)fVar139 | (uint)!bVar18 * auVar106._20_4_;
                  local_280._24_4_ = (uint)bVar19 * (int)fVar140 | (uint)!bVar19 * auVar106._24_4_;
                  local_280._28_4_ =
                       (uint)bVar20 * auVar104._28_4_ | (uint)!bVar20 * auVar106._28_4_;
                  in_ZMM21 = ZEXT3264(auVar105);
                }
              }
            }
            pRVar83 = (RTCIntersectArguments *)((ulong)pRVar85 & 0xffffffff);
            auVar194 = ZEXT3264(local_540);
            auVar178 = ZEXT3264(local_600);
            auVar155 = ZEXT3264(local_620);
            if (local_310 != 0) {
              auVar106 = vsubps_avx(ZEXT1632(auVar92),auVar99);
              local_480 = in_ZMM20._0_32_;
              auVar106 = vfmadd213ps_avx512vl(auVar106,local_480,auVar99);
              auVar146._0_4_ = auVar106._0_4_ + auVar106._0_4_;
              auVar146._4_4_ = auVar106._4_4_ + auVar106._4_4_;
              auVar146._8_4_ = auVar106._8_4_ + auVar106._8_4_;
              auVar146._12_4_ = auVar106._12_4_ + auVar106._12_4_;
              auVar146._16_4_ = auVar106._16_4_ + auVar106._16_4_;
              auVar146._20_4_ = auVar106._20_4_ + auVar106._20_4_;
              auVar146._24_4_ = auVar106._24_4_ + auVar106._24_4_;
              auVar146._28_4_ = auVar106._28_4_ + auVar106._28_4_;
              fVar157 = pre->depth_scale;
              auVar32._4_4_ = fVar157;
              auVar32._0_4_ = fVar157;
              auVar32._8_4_ = fVar157;
              auVar32._12_4_ = fVar157;
              auVar32._16_4_ = fVar157;
              auVar32._20_4_ = fVar157;
              auVar32._24_4_ = fVar157;
              auVar32._28_4_ = fVar157;
              auVar106 = vmulps_avx512vl(auVar146,auVar32);
              local_4a0 = in_ZMM21._0_32_;
              uVar81 = vcmpps_avx512vl(local_4a0,auVar106,6);
              local_310 = local_310 & (byte)uVar81;
              if (local_310 == 0) goto LAB_01d5102d;
              auVar147._8_4_ = 0xbf800000;
              auVar147._0_8_ = 0xbf800000bf800000;
              auVar147._12_4_ = 0xbf800000;
              auVar147._16_4_ = 0xbf800000;
              auVar147._20_4_ = 0xbf800000;
              auVar147._24_4_ = 0xbf800000;
              auVar147._28_4_ = 0xbf800000;
              auVar33._8_4_ = 0x40000000;
              auVar33._0_8_ = 0x4000000040000000;
              auVar33._12_4_ = 0x40000000;
              auVar33._16_4_ = 0x40000000;
              auVar33._20_4_ = 0x40000000;
              auVar33._24_4_ = 0x40000000;
              auVar33._28_4_ = 0x40000000;
              local_3a0 = vfmadd132ps_avx512vl(local_280,auVar147,auVar33);
              local_280 = local_3a0;
              auVar106 = local_280;
              local_360 = (undefined4)lVar89;
              local_350 = local_660;
              local_340 = local_3f0._0_8_;
              uStack_338 = local_3f0._8_8_;
              local_330 = local_400._0_8_;
              uStack_328 = local_400._8_8_;
              local_320 = local_410._0_8_;
              uStack_318 = local_410._8_8_;
              local_680 = CONCAT44(local_680._4_4_,(uint)local_310);
              local_550 = (local_670->scene->geometries).items[local_628].ptr;
              if ((local_550->mask & local_678->mask) == 0) {
                auVar79._12_4_ = 0;
                auVar79._0_12_ = local_640._4_12_;
                local_640._0_16_ = auVar79 << 0x20;
              }
              else if ((local_670->args->filter != (RTCFilterFunctionN)0x0) ||
                      (local_640._0_4_ = 1, local_550->occlusionFilterN != (RTCFilterFunctionN)0x0))
              {
                auVar105 = vaddps_avx512vl(local_480,_DAT_02020f40);
                auVar94 = vcvtsi2ss_avx512f(auVar195._0_16_,local_360);
                fVar157 = auVar94._0_4_;
                local_300[0] = (fVar157 + auVar105._0_4_) * (float)local_3e0._0_4_;
                local_300[1] = (fVar157 + auVar105._4_4_) * (float)local_3e0._4_4_;
                local_300[2] = (fVar157 + auVar105._8_4_) * fStack_3d8;
                local_300[3] = (fVar157 + auVar105._12_4_) * fStack_3d4;
                fStack_2f0 = (fVar157 + auVar105._16_4_) * fStack_3d0;
                fStack_2ec = (fVar157 + auVar105._20_4_) * fStack_3cc;
                fStack_2e8 = (fVar157 + auVar105._24_4_) * fStack_3c8;
                fStack_2e4 = fVar157 + auVar105._28_4_;
                local_280._0_8_ = local_3a0._0_8_;
                local_280._8_8_ = local_3a0._8_8_;
                local_280._16_8_ = local_3a0._16_8_;
                local_280._24_8_ = local_3a0._24_8_;
                local_2e0 = local_280._0_8_;
                uStack_2d8 = local_280._8_8_;
                uStack_2d0 = local_280._16_8_;
                uStack_2c8 = local_280._24_8_;
                local_2c0 = local_4a0;
                local_210 = local_3f0._0_8_;
                uStack_208 = local_3f0._8_8_;
                uVar80 = 0;
                uVar82 = (ulong)(uint)local_310;
                for (uVar84 = uVar82; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000)
                {
                  uVar80 = uVar80 + 1;
                }
                local_220 = local_400._0_8_;
                uStack_218 = local_400._8_8_;
                local_230 = local_410._0_8_;
                uStack_228 = local_410._8_8_;
                uVar81 = CONCAT71((int7)((ulong)local_550 >> 8),1);
                local_3c0 = local_480;
                local_380 = local_4a0;
                local_35c = iVar10;
                local_280 = auVar106;
                do {
                  local_640._0_4_ = (int)uVar81;
                  local_5a4 = local_300[uVar80];
                  local_5a0 = *(undefined4 *)((long)&local_2e0 + uVar80 * 4);
                  local_500 = local_678->tfar;
                  local_678->tfar = *(float *)(local_2c0 + uVar80 * 4);
                  local_5e0.context = local_670->user;
                  fVar157 = 1.0 - local_5a4;
                  auVar24._8_4_ = 0x80000000;
                  auVar24._0_8_ = 0x8000000080000000;
                  auVar24._12_4_ = 0x80000000;
                  auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar157),auVar24);
                  auVar94 = ZEXT416((uint)(local_5a4 * fVar157 * 4.0));
                  auVar92 = vfnmsub213ss_fma(ZEXT416((uint)local_5a4),ZEXT416((uint)local_5a4),
                                             auVar94);
                  auVar94 = vfmadd213ss_fma(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),auVar94);
                  fVar157 = fVar157 * auVar98._0_4_ * 0.5;
                  fVar149 = auVar92._0_4_ * 0.5;
                  fVar162 = auVar94._0_4_ * 0.5;
                  fVar171 = local_5a4 * local_5a4 * 0.5;
                  auVar165._0_4_ = fVar171 * (float)local_230;
                  auVar165._4_4_ = fVar171 * local_230._4_4_;
                  auVar165._8_4_ = fVar171 * (float)uStack_228;
                  auVar165._12_4_ = fVar171 * uStack_228._4_4_;
                  auVar153._4_4_ = fVar162;
                  auVar153._0_4_ = fVar162;
                  auVar153._8_4_ = fVar162;
                  auVar153._12_4_ = fVar162;
                  auVar77._8_8_ = uStack_218;
                  auVar77._0_8_ = local_220;
                  auVar94 = vfmadd132ps_fma(auVar153,auVar165,auVar77);
                  auVar166._4_4_ = fVar149;
                  auVar166._0_4_ = fVar149;
                  auVar166._8_4_ = fVar149;
                  auVar166._12_4_ = fVar149;
                  auVar78._8_8_ = uStack_208;
                  auVar78._0_8_ = local_210;
                  auVar94 = vfmadd132ps_fma(auVar166,auVar94,auVar78);
                  auVar154._4_4_ = fVar157;
                  auVar154._0_4_ = fVar157;
                  auVar154._8_4_ = fVar157;
                  auVar154._12_4_ = fVar157;
                  auVar94 = vfmadd213ps_fma(auVar154,local_660,auVar94);
                  local_5b0 = vmovlps_avx(auVar94);
                  local_5a8 = vextractps_avx(auVar94,2);
                  local_59c = local_664;
                  local_598 = (undefined4)local_628;
                  local_594 = (local_5e0.context)->instID[0];
                  local_590 = (local_5e0.context)->instPrimID[0];
                  local_684 = -1;
                  local_5e0.valid = &local_684;
                  local_5e0.geometryUserPtr = local_550->userPtr;
                  local_5e0.hit = (RTCHitN *)&local_5b0;
                  local_5e0.N = 1;
                  local_680 = uVar82;
                  local_5e0.ray = (RTCRayN *)local_678;
                  local_4f0 = uVar80;
                  if ((local_550->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_550->occlusionFilterN)(&local_5e0), *local_5e0.valid != 0)) {
                    auVar94 = auVar198._0_16_;
                    p_Var12 = local_670->args->filter;
                    if (p_Var12 != (RTCFilterFunctionN)0x0) {
                      if (((local_670->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((local_550->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var12)(&local_5e0);
                      }
                      auVar94 = auVar198._0_16_;
                      if (*local_5e0.valid == 0) goto LAB_01d50fe2;
                    }
                    uVar87 = local_640._0_4_;
                    break;
                  }
LAB_01d50fe2:
                  auVar94 = auVar198._0_16_;
                  local_678->tfar = local_500;
                  uVar80 = 0;
                  uVar82 = local_680 ^ 1L << (local_4f0 & 0x3f);
                  for (uVar84 = uVar82; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000
                      ) {
                    uVar80 = uVar80 + 1;
                  }
                  uVar81 = CONCAT71((int7)(local_4f0 >> 8),uVar82 != 0);
                  uVar87 = (uint)uVar81;
                } while (uVar82 != 0);
                local_640._0_4_ = uVar87 & 0xffffff01;
                auVar94 = vxorps_avx512vl(auVar94,auVar94);
                auVar198 = ZEXT1664(auVar94);
                auVar178 = ZEXT3264(local_600);
                in_ZMM20 = ZEXT3264(local_480);
                auVar155 = ZEXT3264(local_620);
                in_ZMM21 = ZEXT3264(local_4a0);
                auVar196 = ZEXT3264(local_440);
                auVar191 = ZEXT3264(local_460);
                auVar194 = ZEXT3264(local_540);
                pre = local_648;
              }
              pRVar83 = (RTCIntersectArguments *)
                        (ulong)CONCAT31(local_580._1_3_,local_580[0] | local_640[0]);
            }
          }
          lVar89 = lVar89 + 8;
          pRVar85 = pRVar83;
          auVar195 = auVar191;
        } while ((int)lVar89 < iVar10);
      }
      if (((ulong)pRVar83 & 1) != 0) {
        return bVar90;
      }
      fVar157 = local_678->tfar;
      auVar29._4_4_ = fVar157;
      auVar29._0_4_ = fVar157;
      auVar29._8_4_ = fVar157;
      auVar29._12_4_ = fVar157;
      auVar29._16_4_ = fVar157;
      auVar29._20_4_ = fVar157;
      auVar29._24_4_ = fVar157;
      auVar29._28_4_ = fVar157;
      uVar81 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar87 = (uint)uVar88 & (uint)uVar81;
      uVar88 = (ulong)uVar87;
      bVar90 = uVar87 != 0;
      context = local_670;
      ray = local_678;
      pPVar86 = local_650;
    } while (bVar90);
  }
  return bVar90;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }